

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_standard_from_disk.unit.cpp
# Opt level: O0

void __thiscall
TestLoadStandardFromDisk_TestLoadNFRC2003_Test::TestBody
          (TestLoadStandardFromDisk_TestLoadNFRC2003_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  mapped_type *pmVar4;
  reference pvVar5;
  reference pvVar6;
  char *in_R9;
  AssertHelper local_3170;
  Message local_3168;
  double local_3160;
  undefined1 local_3158 [8];
  AssertionResult gtest_ar_140;
  Message local_3140;
  Wavelength_Boundary_Type local_3134;
  undefined1 local_3130 [8];
  AssertionResult gtest_ar_139;
  Message local_3118;
  double local_3110;
  undefined1 local_3108 [8];
  AssertionResult gtest_ar_138;
  Message local_30f0;
  Wavelength_Boundary_Type local_30e4;
  undefined1 local_30e0 [8];
  AssertionResult gtest_ar_137;
  Message local_30c8;
  double local_30c0;
  undefined1 local_30b8 [8];
  AssertionResult gtest_ar_136;
  Message local_30a0;
  Integration_Rule_Type local_3094;
  undefined1 local_3090 [8];
  AssertionResult gtest_ar_135;
  Message local_3078;
  int local_306c;
  size_type local_3068;
  undefined1 local_3060 [8];
  AssertionResult gtest_ar_134;
  Message local_3048;
  Wavelength_Set_Type local_303c;
  undefined1 local_3038 [8];
  AssertionResult gtest_ar_133;
  Message local_3020;
  int local_3014;
  size_type local_3010;
  undefined1 local_3008 [8];
  AssertionResult gtest_ar_132;
  Message local_2ff0;
  Spectrum_Type local_2fe4;
  undefined1 local_2fe0 [8];
  AssertionResult gtest_ar_131;
  AssertHelper local_2fb0;
  Message local_2fa8;
  undefined1 local_2fa0 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_2f70;
  Message local_2f68;
  undefined1 local_2f60 [8];
  AssertionResult gtest_ar__26;
  double local_2f48;
  undefined1 local_2f40 [8];
  pair<double,_double> tkr_source_expected_last_wavelength;
  double local_2f28;
  undefined1 local_2f20 [8];
  pair<double,_double> tkr_source_expected_first_wavelength;
  Message local_2f08;
  int local_2efc;
  size_type local_2ef8;
  undefined1 local_2ef0 [8];
  AssertionResult gtest_ar_130;
  Message local_2ed8;
  Spectrum_Type local_2ecc;
  undefined1 local_2ec8 [8];
  AssertionResult gtest_ar_129;
  Message local_2eb0;
  undefined1 local_2ea8 [8];
  AssertionResult gtest_ar_128;
  Message local_2e90;
  double local_2e88;
  undefined1 local_2e80 [8];
  AssertionResult gtest_ar_127;
  Message local_2e68;
  Wavelength_Boundary_Type local_2e5c;
  undefined1 local_2e58 [8];
  AssertionResult gtest_ar_126;
  Message local_2e40;
  double local_2e38;
  undefined1 local_2e30 [8];
  AssertionResult gtest_ar_125;
  Message local_2e18;
  Wavelength_Boundary_Type local_2e0c;
  undefined1 local_2e08 [8];
  AssertionResult gtest_ar_124;
  Message local_2df0;
  double local_2de8;
  undefined1 local_2de0 [8];
  AssertionResult gtest_ar_123;
  Message local_2dc8;
  Integration_Rule_Type local_2dbc;
  undefined1 local_2db8 [8];
  AssertionResult gtest_ar_122;
  Message local_2da0;
  int local_2d94;
  size_type local_2d90;
  undefined1 local_2d88 [8];
  AssertionResult gtest_ar_121;
  Message local_2d70;
  Wavelength_Set_Type local_2d64;
  undefined1 local_2d60 [8];
  AssertionResult gtest_ar_120;
  Message local_2d48;
  int local_2d3c;
  undefined1 local_2d38 [8];
  AssertionResult gtest_ar_119;
  Message local_2d20;
  double local_2d18;
  undefined1 local_2d10 [8];
  AssertionResult gtest_ar_118;
  Message local_2cf8;
  int local_2cec;
  size_type local_2ce8;
  undefined1 local_2ce0 [8];
  AssertionResult gtest_ar_117;
  Message local_2cc8;
  Spectrum_Type local_2cbc;
  undefined1 local_2cb8 [8];
  AssertionResult gtest_ar_116;
  AssertHelper local_2c88;
  Message local_2c80;
  undefined1 local_2c78 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_2c48;
  Message local_2c40;
  undefined1 local_2c38 [8];
  AssertionResult gtest_ar__24;
  double local_2c20;
  undefined1 local_2c18 [8];
  pair<double,_double> tdw_source_expected_last_wavelength;
  double local_2c00;
  undefined1 local_2bf8 [8];
  pair<double,_double> tdw_source_expected_first_wavelength;
  Message local_2be0;
  int local_2bd4;
  size_type local_2bd0;
  undefined1 local_2bc8 [8];
  AssertionResult gtest_ar_115;
  Message local_2bb0;
  Spectrum_Type local_2ba4;
  undefined1 local_2ba0 [8];
  AssertionResult gtest_ar_114;
  Message local_2b88;
  undefined1 local_2b80 [8];
  AssertionResult gtest_ar_113;
  Message local_2b68;
  double local_2b60;
  undefined1 local_2b58 [8];
  AssertionResult gtest_ar_112;
  Message local_2b40;
  Wavelength_Boundary_Type local_2b34;
  undefined1 local_2b30 [8];
  AssertionResult gtest_ar_111;
  Message local_2b18;
  double local_2b10;
  undefined1 local_2b08 [8];
  AssertionResult gtest_ar_110;
  Message local_2af0;
  Wavelength_Boundary_Type local_2ae4;
  undefined1 local_2ae0 [8];
  AssertionResult gtest_ar_109;
  Message local_2ac8;
  double local_2ac0;
  undefined1 local_2ab8 [8];
  AssertionResult gtest_ar_108;
  Message local_2aa0;
  Integration_Rule_Type local_2a94;
  undefined1 local_2a90 [8];
  AssertionResult gtest_ar_107;
  Message local_2a78;
  int local_2a6c;
  size_type local_2a68;
  undefined1 local_2a60 [8];
  AssertionResult gtest_ar_106;
  Message local_2a48;
  Wavelength_Set_Type local_2a3c;
  undefined1 local_2a38 [8];
  AssertionResult gtest_ar_105;
  AssertHelper local_2a08;
  Message local_2a00;
  undefined1 local_29f8 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_29c8;
  Message local_29c0;
  undefined1 local_29b8 [8];
  AssertionResult gtest_ar__22;
  double local_29a0;
  undefined1 local_2998 [8];
  pair<double,_double> spf_detector_expected_last_nonzero_wavelength;
  double local_2980;
  undefined1 local_2978 [8];
  pair<double,_double> spf_detector_expected_first_nonzero_wavelength;
  Message local_2960;
  int local_2954;
  size_type local_2950;
  undefined1 local_2948 [8];
  AssertionResult gtest_ar_104;
  Message local_2930;
  Spectrum_Type local_2924;
  undefined1 local_2920 [8];
  AssertionResult gtest_ar_103;
  AssertHelper local_28f0;
  Message local_28e8;
  undefined1 local_28e0 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_28b0;
  Message local_28a8;
  undefined1 local_28a0 [8];
  AssertionResult gtest_ar__20;
  double local_2888;
  undefined1 local_2880 [8];
  pair<double,_double> spf_source_expected_last_wavelength;
  double local_2868;
  undefined1 local_2860 [8];
  pair<double,_double> spf_source_expected_first_wavelength;
  Message local_2848;
  int local_283c;
  size_type local_2838;
  undefined1 local_2830 [8];
  AssertionResult gtest_ar_102;
  Message local_2818;
  Spectrum_Type local_280c;
  undefined1 local_2808 [8];
  AssertionResult gtest_ar_101;
  Message local_27f0;
  undefined1 local_27e8 [8];
  AssertionResult gtest_ar_100;
  Message local_27d0;
  double local_27c8;
  undefined1 local_27c0 [8];
  AssertionResult gtest_ar_99;
  Message local_27a8;
  Wavelength_Boundary_Type local_279c;
  undefined1 local_2798 [8];
  AssertionResult gtest_ar_98;
  Message local_2780;
  double local_2778;
  undefined1 local_2770 [8];
  AssertionResult gtest_ar_97;
  Message local_2758;
  Wavelength_Boundary_Type local_274c;
  undefined1 local_2748 [8];
  AssertionResult gtest_ar_96;
  Message local_2730;
  double local_2728;
  undefined1 local_2720 [8];
  AssertionResult gtest_ar_95;
  Message local_2708;
  Integration_Rule_Type local_26fc;
  undefined1 local_26f8 [8];
  AssertionResult gtest_ar_94;
  Message local_26e0;
  int local_26d4;
  size_type local_26d0;
  undefined1 local_26c8 [8];
  AssertionResult gtest_ar_93;
  Message local_26b0;
  Wavelength_Set_Type local_26a4;
  undefined1 local_26a0 [8];
  AssertionResult gtest_ar_92;
  Message local_2688;
  Spectrum_Type local_267c;
  undefined1 local_2678 [8];
  AssertionResult gtest_ar_91;
  AssertHelper local_2648;
  Message local_2640;
  undefined1 local_2638 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_2608;
  Message local_2600;
  undefined1 local_25f8 [8];
  AssertionResult gtest_ar__18;
  double local_25e0;
  undefined1 local_25d8 [8];
  pair<double,_double> tuv_source_expected_last_wavelength;
  double local_25c0;
  undefined1 local_25b8 [8];
  pair<double,_double> tuv_source_expected_first_wavelength;
  Message local_25a0;
  int local_2594;
  size_type local_2590;
  undefined1 local_2588 [8];
  AssertionResult gtest_ar_90;
  Message local_2570;
  Spectrum_Type local_2564;
  undefined1 local_2560 [8];
  AssertionResult gtest_ar_89;
  Message local_2548;
  undefined1 local_2540 [8];
  AssertionResult gtest_ar_88;
  Message local_2528;
  Wavelength_Boundary_Type local_251c;
  undefined1 local_2518 [8];
  AssertionResult gtest_ar_87;
  Message local_2500;
  double local_24f8;
  undefined1 local_24f0 [8];
  AssertionResult gtest_ar_86;
  Message local_24d8;
  Wavelength_Boundary_Type local_24cc;
  undefined1 local_24c8 [8];
  AssertionResult gtest_ar_85;
  Message local_24b0;
  double local_24a8;
  undefined1 local_24a0 [8];
  AssertionResult gtest_ar_84;
  Message local_2488;
  Integration_Rule_Type local_247c;
  undefined1 local_2478 [8];
  AssertionResult gtest_ar_83;
  Message local_2460;
  int local_2454;
  size_type local_2450;
  undefined1 local_2448 [8];
  AssertionResult gtest_ar_82;
  Message local_2430;
  Wavelength_Set_Type local_2424;
  undefined1 local_2420 [8];
  AssertionResult gtest_ar_81;
  Message local_2408;
  int local_23fc;
  size_type local_23f8;
  undefined1 local_23f0 [8];
  AssertionResult gtest_ar_80;
  Message local_23d8;
  Spectrum_Type local_23cc;
  undefined1 local_23c8 [8];
  AssertionResult gtest_ar_79;
  Message local_23b0;
  int local_23a4;
  undefined1 local_23a0 [8];
  AssertionResult gtest_ar_78;
  Message local_2388;
  int local_237c;
  size_type local_2378;
  undefined1 local_2370 [8];
  AssertionResult gtest_ar_77;
  Message local_2358;
  Spectrum_Type local_234c;
  undefined1 local_2348 [8];
  AssertionResult gtest_ar_76;
  Message local_2330;
  undefined1 local_2328 [8];
  AssertionResult gtest_ar_75;
  Message local_2310;
  double local_2308;
  undefined1 local_2300 [8];
  AssertionResult gtest_ar_74;
  Message local_22e8;
  Wavelength_Boundary_Type local_22dc;
  undefined1 local_22d8 [8];
  AssertionResult gtest_ar_73;
  Message local_22c0;
  double local_22b8;
  undefined1 local_22b0 [8];
  AssertionResult gtest_ar_72;
  Message local_2298;
  Wavelength_Boundary_Type local_228c;
  undefined1 local_2288 [8];
  AssertionResult gtest_ar_71;
  Message local_2270;
  double local_2268;
  undefined1 local_2260 [8];
  AssertionResult gtest_ar_70;
  Message local_2248;
  Integration_Rule_Type local_223c;
  undefined1 local_2238 [8];
  AssertionResult gtest_ar_69;
  Message local_2220;
  double local_2218;
  undefined1 local_2210 [8];
  AssertionResult gtest_ar_68;
  Message local_21f8;
  double local_21f0;
  undefined1 local_21e8 [8];
  AssertionResult gtest_ar_67;
  Message local_21d0;
  int local_21c4;
  size_type local_21c0;
  undefined1 local_21b8 [8];
  AssertionResult gtest_ar_66;
  Message local_21a0;
  Wavelength_Set_Type local_2194;
  undefined1 local_2190 [8];
  AssertionResult gtest_ar_65;
  AssertHelper local_2160;
  Message local_2158;
  undefined1 local_2150 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_2120;
  Message local_2118;
  undefined1 local_2110 [8];
  AssertionResult gtest_ar__16;
  double local_20f8;
  undefined1 local_20f0 [8];
  pair<double,_double> tristim_z_detector_expected_last_nonzero_wavelength;
  double local_20d8;
  undefined1 local_20d0 [8];
  pair<double,_double> tristim_z_detector_expected_first_nonzero_wavelength;
  Message local_20b8;
  int local_20ac;
  size_type local_20a8;
  undefined1 local_20a0 [8];
  AssertionResult gtest_ar_64;
  Message local_2088;
  Spectrum_Type local_207c;
  undefined1 local_2078 [8];
  AssertionResult gtest_ar_63;
  AssertHelper local_2048;
  Message local_2040;
  undefined1 local_2038 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_2008;
  Message local_2000;
  undefined1 local_1ff8 [8];
  AssertionResult gtest_ar__14;
  double local_1fe0;
  undefined1 local_1fd8 [8];
  pair<double,_double> tristim_z_source_expected_last_wavelength;
  double local_1fc0;
  undefined1 local_1fb8 [8];
  pair<double,_double> tristim_z_source_expected_first_wavelength;
  Message local_1fa0;
  int local_1f94;
  size_type local_1f90;
  undefined1 local_1f88 [8];
  AssertionResult gtest_ar_62;
  Message local_1f70;
  Spectrum_Type local_1f64;
  undefined1 local_1f60 [8];
  AssertionResult gtest_ar_61;
  Message local_1f48;
  undefined1 local_1f40 [8];
  AssertionResult gtest_ar_60;
  Message local_1f28;
  double local_1f20;
  undefined1 local_1f18 [8];
  AssertionResult gtest_ar_59;
  Message local_1f00;
  Wavelength_Boundary_Type local_1ef4;
  undefined1 local_1ef0 [8];
  AssertionResult gtest_ar_58;
  Message local_1ed8;
  double local_1ed0;
  undefined1 local_1ec8 [8];
  AssertionResult gtest_ar_57;
  Message local_1eb0;
  Wavelength_Boundary_Type local_1ea4;
  undefined1 local_1ea0 [8];
  AssertionResult gtest_ar_56;
  Message local_1e88;
  double local_1e80;
  undefined1 local_1e78 [8];
  AssertionResult gtest_ar_55;
  Message local_1e60;
  Integration_Rule_Type local_1e54;
  undefined1 local_1e50 [8];
  AssertionResult gtest_ar_54;
  Message local_1e38;
  double local_1e30;
  undefined1 local_1e28 [8];
  AssertionResult gtest_ar_53;
  Message local_1e10;
  double local_1e08;
  undefined1 local_1e00 [8];
  AssertionResult gtest_ar_52;
  Message local_1de8;
  int local_1ddc;
  size_type local_1dd8;
  undefined1 local_1dd0 [8];
  AssertionResult gtest_ar_51;
  Message local_1db8;
  Wavelength_Set_Type local_1dac;
  undefined1 local_1da8 [8];
  AssertionResult gtest_ar_50;
  AssertHelper local_1d78;
  Message local_1d70;
  undefined1 local_1d68 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_1d38;
  Message local_1d30;
  undefined1 local_1d28 [8];
  AssertionResult gtest_ar__12;
  double local_1d10;
  undefined1 local_1d08 [8];
  pair<double,_double> tristim_y_detector_expected_last_nonzero_wavelength;
  double local_1cf0;
  undefined1 local_1ce8 [8];
  pair<double,_double> tristim_y_detector_expected_first_nonzero_wavelength;
  Message local_1cd0;
  int local_1cc4;
  size_type local_1cc0;
  undefined1 local_1cb8 [8];
  AssertionResult gtest_ar_49;
  Message local_1ca0;
  Spectrum_Type local_1c94;
  undefined1 local_1c90 [8];
  AssertionResult gtest_ar_48;
  AssertHelper local_1c60;
  Message local_1c58;
  undefined1 local_1c50 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_1c20;
  Message local_1c18;
  undefined1 local_1c10 [8];
  AssertionResult gtest_ar__10;
  double local_1bf8;
  undefined1 local_1bf0 [8];
  pair<double,_double> tristim_y_source_expected_last_wavelength;
  double local_1bd8;
  undefined1 local_1bd0 [8];
  pair<double,_double> tristim_y_source_expected_first_wavelength;
  Message local_1bb8;
  int local_1bac;
  size_type local_1ba8;
  undefined1 local_1ba0 [8];
  AssertionResult gtest_ar_47;
  Message local_1b88;
  Spectrum_Type local_1b7c;
  undefined1 local_1b78 [8];
  AssertionResult gtest_ar_46;
  Message local_1b60;
  undefined1 local_1b58 [8];
  AssertionResult gtest_ar_45;
  Message local_1b40;
  double local_1b38;
  undefined1 local_1b30 [8];
  AssertionResult gtest_ar_44;
  Message local_1b18;
  Wavelength_Boundary_Type local_1b0c;
  undefined1 local_1b08 [8];
  AssertionResult gtest_ar_43;
  Message local_1af0;
  double local_1ae8;
  undefined1 local_1ae0 [8];
  AssertionResult gtest_ar_42;
  Message local_1ac8;
  Wavelength_Boundary_Type local_1abc;
  undefined1 local_1ab8 [8];
  AssertionResult gtest_ar_41;
  Message local_1aa0;
  double local_1a98;
  undefined1 local_1a90 [8];
  AssertionResult gtest_ar_40;
  Message local_1a78;
  Integration_Rule_Type local_1a6c;
  undefined1 local_1a68 [8];
  AssertionResult gtest_ar_39;
  Message local_1a50;
  double local_1a48;
  undefined1 local_1a40 [8];
  AssertionResult gtest_ar_38;
  Message local_1a28;
  double local_1a20;
  undefined1 local_1a18 [8];
  AssertionResult gtest_ar_37;
  Message local_1a00;
  int local_19f4;
  size_type local_19f0;
  undefined1 local_19e8 [8];
  AssertionResult gtest_ar_36;
  Message local_19d0;
  Wavelength_Set_Type local_19c4;
  undefined1 local_19c0 [8];
  AssertionResult gtest_ar_35;
  AssertHelper local_1990;
  Message local_1988;
  undefined1 local_1980 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_1950;
  Message local_1948;
  undefined1 local_1940 [8];
  AssertionResult gtest_ar__8;
  double local_1928;
  undefined1 local_1920 [8];
  pair<double,_double> tristim_x_detector_expected_last_nonzero_wavelength;
  double local_1908;
  undefined1 local_1900 [8];
  pair<double,_double> tristim_x_detector_expected_first_nonzero_wavelength;
  Message local_18e8;
  int local_18dc;
  size_type local_18d8;
  undefined1 local_18d0 [8];
  AssertionResult gtest_ar_34;
  Message local_18b8;
  Spectrum_Type local_18ac;
  undefined1 local_18a8 [8];
  AssertionResult gtest_ar_33;
  AssertHelper local_1878;
  Message local_1870;
  undefined1 local_1868 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1838;
  Message local_1830;
  undefined1 local_1828 [8];
  AssertionResult gtest_ar__6;
  double local_1810;
  undefined1 local_1808 [8];
  pair<double,_double> tristim_x_source_expected_last_wavelength;
  double local_17f0;
  undefined1 local_17e8 [8];
  pair<double,_double> tristim_x_source_expected_first_wavelength;
  Message local_17d0;
  int local_17c4;
  size_type local_17c0;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar_32;
  Message local_17a0;
  Spectrum_Type local_1794;
  undefined1 local_1790 [8];
  AssertionResult gtest_ar_31;
  Message local_1778;
  undefined1 local_1770 [8];
  AssertionResult gtest_ar_30;
  Message local_1758;
  double local_1750;
  undefined1 local_1748 [8];
  AssertionResult gtest_ar_29;
  Message local_1730;
  Wavelength_Boundary_Type local_1724;
  undefined1 local_1720 [8];
  AssertionResult gtest_ar_28;
  Message local_1708;
  double local_1700;
  undefined1 local_16f8 [8];
  AssertionResult gtest_ar_27;
  Message local_16e0;
  Wavelength_Boundary_Type local_16d4;
  undefined1 local_16d0 [8];
  AssertionResult gtest_ar_26;
  Message local_16b8;
  double local_16b0;
  undefined1 local_16a8 [8];
  AssertionResult gtest_ar_25;
  Message local_1690;
  Integration_Rule_Type local_1684;
  undefined1 local_1680 [8];
  AssertionResult gtest_ar_24;
  Message local_1668;
  double local_1660;
  undefined1 local_1658 [8];
  AssertionResult gtest_ar_23;
  Message local_1640;
  double local_1638;
  undefined1 local_1630 [8];
  AssertionResult gtest_ar_22;
  Message local_1618;
  int local_160c;
  size_type local_1608;
  undefined1 local_1600 [8];
  AssertionResult gtest_ar_21;
  Message local_15e8;
  Wavelength_Set_Type local_15dc;
  undefined1 local_15d8 [8];
  AssertionResult gtest_ar_20;
  AssertHelper local_15a8;
  Message local_15a0;
  undefined1 local_1598 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1568;
  Message local_1560;
  undefined1 local_1558 [8];
  AssertionResult gtest_ar__4;
  double local_1540;
  undefined1 local_1538 [8];
  pair<double,_double> photopic_detector_expected_last_nonzero_wavelength;
  double local_1520;
  undefined1 local_1518 [8];
  pair<double,_double> photopic_detector_expected_first_nonzero_wavelength;
  Message local_1500;
  int local_14f4;
  size_type local_14f0;
  undefined1 local_14e8 [8];
  AssertionResult gtest_ar_19;
  Message local_14d0;
  Spectrum_Type local_14c4;
  undefined1 local_14c0 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_1490;
  Message local_1488;
  undefined1 local_1480 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1450;
  Message local_1448;
  undefined1 local_1440 [8];
  AssertionResult gtest_ar__2;
  double local_1428;
  undefined1 local_1420 [8];
  pair<double,_double> photopic_source_expected_last_wavelength;
  double local_1408;
  undefined1 local_1400 [8];
  pair<double,_double> photopic_source_expected_first_wavelength;
  Message local_13e8;
  int local_13dc;
  size_type local_13d8;
  undefined1 local_13d0 [8];
  AssertionResult gtest_ar_17;
  Message local_13b8;
  Spectrum_Type local_13ac;
  undefined1 local_13a8 [8];
  AssertionResult gtest_ar_16;
  Message local_1390;
  undefined1 local_1388 [8];
  AssertionResult gtest_ar_15;
  Message local_1370;
  double local_1368;
  undefined1 local_1360 [8];
  AssertionResult gtest_ar_14;
  Message local_1348;
  Wavelength_Boundary_Type local_133c;
  undefined1 local_1338 [8];
  AssertionResult gtest_ar_13;
  Message local_1320;
  double local_1318;
  undefined1 local_1310 [8];
  AssertionResult gtest_ar_12;
  Message local_12f8;
  Wavelength_Boundary_Type local_12ec;
  undefined1 local_12e8 [8];
  AssertionResult gtest_ar_11;
  Message local_12d0;
  double local_12c8;
  undefined1 local_12c0 [8];
  AssertionResult gtest_ar_10;
  Message local_12a8;
  Integration_Rule_Type local_129c;
  undefined1 local_1298 [8];
  AssertionResult gtest_ar_9;
  Message local_1280;
  int local_1274;
  size_type local_1270;
  undefined1 local_1268 [8];
  AssertionResult gtest_ar_8;
  Message local_1250;
  Wavelength_Set_Type local_1244;
  undefined1 local_1240 [8];
  AssertionResult gtest_ar_7;
  Message local_1228;
  int local_121c;
  size_type local_1218;
  undefined1 local_1210 [8];
  AssertionResult gtest_ar_6;
  Message local_11f8;
  Spectrum_Type local_11ec;
  undefined1 local_11e8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_11b8;
  Message local_11b0;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1178;
  Message local_1170;
  undefined1 local_1168 [8];
  AssertionResult gtest_ar_;
  double local_1150;
  undefined1 local_1148 [8];
  pair<double,_double> solar_expected_last_wavelength;
  double local_1130;
  undefined1 local_1128 [8];
  pair<double,_double> solar_expected_first_wavelength;
  Message local_1110;
  int local_1104;
  size_type local_1100;
  undefined1 local_10f8 [8];
  AssertionResult gtest_ar_4;
  Message local_10e0;
  Spectrum_Type local_10d4;
  undefined1 local_10d0 [8];
  AssertionResult gtest_ar_3;
  Message local_10b8;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_2;
  key_type local_1098;
  undefined1 local_1078 [8];
  Optical_Standard_Method tkr;
  key_type local_f10;
  undefined1 local_ef0 [8];
  Optical_Standard_Method tdw;
  key_type local_d88;
  undefined1 local_d68 [8];
  Optical_Standard_Method spf;
  key_type local_c00;
  undefined1 local_be0 [8];
  Optical_Standard_Method tuv;
  key_type local_a78;
  undefined1 local_a58 [8];
  Optical_Standard_Method thermal_ir;
  key_type local_8f0;
  undefined1 local_8d0 [8];
  Optical_Standard_Method tristim_z;
  key_type local_768;
  undefined1 local_748 [8];
  Optical_Standard_Method tristim_y;
  key_type local_5e0;
  undefined1 local_5c0 [8];
  Optical_Standard_Method tristim_x;
  key_type local_458;
  undefined1 local_438 [8];
  Optical_Standard_Method photopic;
  key_type local_2d0;
  undefined1 local_2b0 [8];
  Optical_Standard_Method solar;
  Message local_148;
  int local_13c;
  size_type local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  undefined1 local_e0 [8];
  Optical_Standard nfrc;
  undefined1 local_40 [8];
  path nfrc_std_path;
  ScopedTrace gtest_trace_34;
  TestLoadStandardFromDisk_TestLoadNFRC2003_Test *this_local;
  
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)&nfrc_std_path.field_0x27,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
             ,0x22,"Begin Test: Load NFRC 2003 from disk.");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_40,&test_dir_abi_cxx11_,auto_format);
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [10])"standards");
  std::filesystem::__cxx11::path::operator/=((path *)local_40,(char (*) [17])"W5_NFRC_2003.std");
  std::filesystem::__cxx11::path::string((string *)&gtest_ar.message_,(path *)local_40);
  window_standards::load_optical_standard((Optical_Standard *)local_e0,(string *)&gtest_ar.message_)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[52],_nullptr>
            ((EqHelper *)local_110,"nfrc.description",
             "\"Consistent with NFRC 300-2003 - default for WINDOW5\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&nfrc.name.field_2 + 8),
             (char (*) [52])"Consistent with NFRC 300-2003 - default for WINDOW5");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_138 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                      *)((long)&nfrc.file.field_2 + 8));
  local_13c = 10;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_130,"nfrc.methods.size()","10",&local_138,&local_13c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pMVar3 = testing::Message::operator<<(&local_148,(char (*) [25])"Number of methods loaded");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&solar.max_wavelength.value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&solar.max_wavelength.value,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&solar.max_wavelength.value);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"SOLAR",
             (allocator<char> *)((long)&photopic.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_2d0);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_2b0,pmVar4);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&photopic.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"PHOTOPIC",
             (allocator<char> *)((long)&tristim_x.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_458);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_438,pmVar4);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tristim_x.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"COLOR_TRISTIMX",
             (allocator<char> *)((long)&tristim_y.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_5e0);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_5c0,pmVar4);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tristim_y.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"COLOR_TRISTIMY",
             (allocator<char> *)((long)&tristim_z.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_768);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_748,pmVar4);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tristim_z.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"COLOR_TRISTIMZ",
             (allocator<char> *)((long)&thermal_ir.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_8f0);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_8d0,pmVar4);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&thermal_ir.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,"THERMAL IR",
             (allocator<char> *)((long)&tuv.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_a78);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_a58,pmVar4);
  std::__cxx11::string::~string((string *)&local_a78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tuv.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c00,"TUV",(allocator<char> *)((long)&spf.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_c00);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_be0,pmVar4);
  std::__cxx11::string::~string((string *)&local_c00);
  std::allocator<char>::~allocator((allocator<char> *)((long)&spf.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d88,"SPF",(allocator<char> *)((long)&tdw.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_d88);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_d68,pmVar4);
  std::__cxx11::string::~string((string *)&local_d88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tdw.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f10,"TDW",(allocator<char> *)((long)&tkr.max_wavelength.value + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_f10);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_ef0,pmVar4);
  std::__cxx11::string::~string((string *)&local_f10);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tkr.max_wavelength.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1098,"TKR",
             (allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
                         *)((long)&nfrc.file.field_2 + 8),&local_1098);
  window_standards::Optical_Standard_Method::Optical_Standard_Method
            ((Optical_Standard_Method *)local_1078,pmVar4);
  std::__cxx11::string::~string((string *)&local_1098);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_10b0,"solar.name","\"SOLAR\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
             (char (*) [6])"SOLAR");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b0);
  if (!bVar1) {
    testing::Message::Message(&local_10b8);
    pMVar3 = testing::Message::operator<<(&local_10b8,(char (*) [18])"Solar method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_10b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b0);
  local_10d4 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_10d0,"solar.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(solar.description.field_2._M_local_buf + 8),&local_10d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10d0);
  if (!bVar1) {
    testing::Message::Message(&local_10e0);
    pMVar3 = testing::Message::operator<<(&local_10e0,(char (*) [27])"Solar source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_10e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10d0);
  local_1100 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&solar.source_spectrum.b);
  local_1104 = 0x79;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_10f8,"solar.source_spectrum.values.size()","121",&local_1100,
             &local_1104);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f8);
  if (!bVar1) {
    testing::Message::Message(&local_1110);
    pMVar3 = testing::Message::operator<<
                       (&local_1110,(char (*) [39])"Solar source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&solar_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&solar_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&solar_expected_first_wavelength.second);
    testing::Message::~Message(&local_1110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f8);
  local_1130 = 0.3;
  solar_expected_last_wavelength.second = 0.0;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1128,&local_1130,&solar_expected_last_wavelength.second);
  local_1150 = 4.045;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x401b99999999999a;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1148,&local_1150,(double *)&gtest_ar_.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&solar.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_1168,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1168);
  if (!bVar1) {
    testing::Message::Message(&local_1170);
    pMVar3 = testing::Message::operator<<
                       (&local_1170,(char (*) [34])"Solar source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1168,
               (AssertionResult *)
               "PAIR_NEAR(solar.source_spectrum.values[0], solar_expected_first_wavelength, 1e-14)",
               "false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1178,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1178);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&solar.source_spectrum.b,0x78);
  PAIR_NEAR((pair<double,_double> *)local_11a8,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(&local_11b0);
    pMVar3 = testing::Message::operator<<
                       (&local_11b0,(char (*) [33])"Solar source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_11a8,
               (AssertionResult *)
               "PAIR_NEAR(solar.source_spectrum.values[120], solar_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_11b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_11b8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_11b8);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_11b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  local_11ec = NONE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_11e8,"solar.detector_spectrum.type","Spectrum_Type::NONE",
             (Spectrum_Type *)
             &solar.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_11ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e8);
  if (!bVar1) {
    testing::Message::Message(&local_11f8);
    pMVar3 = testing::Message::operator<<(&local_11f8,(char (*) [29])"Solar detector spectrum type")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_11f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e8);
  local_1218 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&solar.detector_spectrum.b);
  local_121c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1210,"solar.detector_spectrum.values.size()","0",&local_1218,
             &local_121c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1210);
  if (!bVar1) {
    testing::Message::Message(&local_1228);
    pMVar3 = testing::Message::operator<<
                       (&local_1228,(char (*) [41])"Solar detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1210);
  local_1244 = SOURCE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_1240,"solar.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             (Wavelength_Set_Type *)
             &solar.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1244);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1240);
  if (!bVar1) {
    testing::Message::Message(&local_1250);
    pMVar3 = testing::Message::operator<<(&local_1250,(char (*) [26])"Solar wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1240);
  local_1270 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&solar.wavelength_set.description.field_2 + 8));
  local_1274 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1268,"solar.wavelength_set.values.size()","0",&local_1270,&local_1274
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1268);
  if (!bVar1) {
    testing::Message::Message(&local_1280);
    pMVar3 = testing::Message::operator<<
                       (&local_1280,(char (*) [38])"Solar wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1268);
  local_129c = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_1298,"solar.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",
             (Integration_Rule_Type *)
             &solar.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_129c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1298);
  if (!bVar1) {
    testing::Message::Message(&local_12a8);
    pMVar3 = testing::Message::operator<<(&local_12a8,(char (*) [28])"Solar integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_12a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1298);
  local_12c8 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_12c0,"solar.integration_rule.k","1.0",
             (double *)&solar.integration_rule,&local_12c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c0);
  if (!bVar1) {
    testing::Message::Message(&local_12d0);
    pMVar3 = testing::Message::operator<<(&local_12d0,(char (*) [25])"Solar integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_12d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c0);
  local_12ec = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_12e8,"solar.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&solar.integration_rule.k,&local_12ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12e8);
  if (!bVar1) {
    testing::Message::Message(&local_12f8);
    pMVar3 = testing::Message::operator<<
                       (&local_12f8,(char (*) [30])"Solar minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_12f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12e8);
  local_1318 = 0.3;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1310,"solar.min_wavelength.value","0.3",
             (double *)&solar.min_wavelength,&local_1318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1310);
  if (!bVar1) {
    testing::Message::Message(&local_1320);
    pMVar3 = testing::Message::operator<<
                       (&local_1320,(char (*) [31])"Solar minimum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_1320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1310);
  local_133c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_1338,"solar.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&solar.min_wavelength.value,&local_133c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1338);
  if (!bVar1) {
    testing::Message::Message(&local_1348);
    pMVar3 = testing::Message::operator<<
                       (&local_1348,(char (*) [30])"Solar maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_1348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1338);
  local_1368 = 2.5;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1360,"solar.max_wavelength.value","2.5",
             (double *)&solar.max_wavelength,&local_1368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1360);
  if (!bVar1) {
    testing::Message::Message(&local_1370);
    pMVar3 = testing::Message::operator<<
                       (&local_1370,(char (*) [31])"Solar maximum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_1370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1360);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
            ((EqHelper *)local_1388,"photopic.name","\"PHOTOPIC\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
             (char (*) [9])"PHOTOPIC");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
  if (!bVar1) {
    testing::Message::Message(&local_1390);
    pMVar3 = testing::Message::operator<<(&local_1390,(char (*) [21])"Photopic method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_1390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
  local_13ac = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_13a8,"photopic.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(photopic.description.field_2._M_local_buf + 8),&local_13ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13a8);
  if (!bVar1) {
    testing::Message::Message(&local_13b8);
    pMVar3 = testing::Message::operator<<
                       (&local_13b8,(char (*) [30])"Photopic source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_13b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13a8);
  local_13d8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&photopic.source_spectrum.b);
  local_13dc = 0x213;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_13d0,"photopic.source_spectrum.values.size()","531",&local_13d8,
             &local_13dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13d0);
  if (!bVar1) {
    testing::Message::Message(&local_13e8);
    pMVar3 = testing::Message::operator<<
                       (&local_13e8,(char (*) [42])"Photopic source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&photopic_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&photopic_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&photopic_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_13e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13d0);
  local_1408 = 0.3;
  photopic_source_expected_last_wavelength.second = 0.0341;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1400,&local_1408,
             &photopic_source_expected_last_wavelength.second);
  local_1428 = 0.83;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x404e280000000000;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1420,&local_1428,(double *)&gtest_ar__2.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&photopic.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_1440,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1440);
  if (!bVar1) {
    testing::Message::Message(&local_1448);
    pMVar3 = testing::Message::operator<<
                       (&local_1448,(char (*) [37])"Photopic source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1440,
               (AssertionResult *)
               "PAIR_NEAR(photopic.source_spectrum.values[0], photopic_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__3.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1450,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1450);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1440);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&photopic.source_spectrum.b,0x212);
  PAIR_NEAR((pair<double,_double> *)local_1480,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1480);
  if (!bVar1) {
    testing::Message::Message(&local_1488);
    pMVar3 = testing::Message::operator<<
                       (&local_1488,(char (*) [36])"Photopic source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_18.message_,(internal *)local_1480,
               (AssertionResult *)
               "PAIR_NEAR(photopic.source_spectrum.values[530], photopic_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_18.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1490,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1490);
    std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_1488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1480);
  local_14c4 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_14c0,"photopic.detector_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)
             &photopic.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_14c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14c0);
  if (!bVar1) {
    testing::Message::Message(&local_14d0);
    pMVar3 = testing::Message::operator<<
                       (&local_14d0,(char (*) [32])"Photopic detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_14d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14c0);
  local_14f0 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&photopic.detector_spectrum.b);
  local_14f4 = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_14e8,"photopic.detector_spectrum.values.size()","81",&local_14f0,
             &local_14f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14e8);
  if (!bVar1) {
    testing::Message::Message(&local_1500);
    pMVar3 = testing::Message::operator<<
                       (&local_1500,(char (*) [44])"Photopic detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_14e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&photopic_detector_expected_first_nonzero_wavelength.second,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&photopic_detector_expected_first_nonzero_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&photopic_detector_expected_first_nonzero_wavelength.second);
    testing::Message::~Message(&local_1500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14e8);
  local_1520 = 0.385;
  photopic_detector_expected_last_nonzero_wavelength.second = 0.0001;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1518,&local_1520,
             &photopic_detector_expected_last_nonzero_wavelength.second);
  local_1540 = 0.76;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f1a36e2eb1c432d;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1538,&local_1540,(double *)&gtest_ar__4.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&photopic.detector_spectrum.b,1);
  PAIR_NEAR((pair<double,_double> *)local_1558,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1558);
  if (!bVar1) {
    testing::Message::Message(&local_1560);
    pMVar3 = testing::Message::operator<<
                       (&local_1560,(char (*) [47])"Photopic detector spectrum first nonzero point")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1558,
               (AssertionResult *)
               "PAIR_NEAR(photopic.detector_spectrum.values[1], photopic_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1568,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1568);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1558);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&photopic.detector_spectrum.b,0x4c);
  PAIR_NEAR((pair<double,_double> *)local_1598,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1598);
  if (!bVar1) {
    testing::Message::Message(&local_15a0);
    pMVar3 = testing::Message::operator<<
                       (&local_15a0,(char (*) [46])"Photopic detector spectrum last nonzero point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_20.message_,(internal *)local_1598,
               (AssertionResult *)
               "PAIR_NEAR(photopic.detector_spectrum.values[76], photopic_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_20.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_15a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_15a8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_15a8);
    std::__cxx11::string::~string((string *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_15a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1598);
  local_15dc = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_15d8,"photopic.wavelength_set.type","Wavelength_Set_Type::FILE",
             (Wavelength_Set_Type *)
             &photopic.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_15dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15d8);
  if (!bVar1) {
    testing::Message::Message(&local_15e8);
    pMVar3 = testing::Message::operator<<(&local_15e8,(char (*) [29])"Photopic wavelength set type")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_15d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_15e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15d8);
  local_1608 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&photopic.wavelength_set.description.field_2 + 8));
  local_160c = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1600,"photopic.wavelength_set.values.size()","81",&local_1608,
             &local_160c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1600);
  if (!bVar1) {
    testing::Message::Message(&local_1618);
    pMVar3 = testing::Message::operator<<
                       (&local_1618,(char (*) [41])"Photopic wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_1618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1600);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&photopic.wavelength_set.description.field_2 + 8),0);
  local_1638 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1630,"photopic.wavelength_set.values[0]","0.38",pvVar6,&local_1638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1630);
  if (!bVar1) {
    testing::Message::Message(&local_1640);
    pMVar3 = testing::Message::operator<<
                       (&local_1640,(char (*) [36])"Photopic wavelength set first point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_1640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1630);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&photopic.wavelength_set.description.field_2 + 8),0x50);
  local_1660 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1658,"photopic.wavelength_set.values[80]","0.78",pvVar6,&local_1660);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1658);
  if (!bVar1) {
    testing::Message::Message(&local_1668);
    pMVar3 = testing::Message::operator<<
                       (&local_1668,(char (*) [35])"Photopic wavelength set last point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_1668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1658);
  local_1684 = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_1680,"photopic.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",
             (Integration_Rule_Type *)
             &photopic.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1684);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1680);
  if (!bVar1) {
    testing::Message::Message(&local_1690);
    pMVar3 = testing::Message::operator<<
                       (&local_1690,(char (*) [31])"Photopic integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_1690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1680);
  local_16b0 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_16a8,"photopic.integration_rule.k","1.0",
             (double *)&photopic.integration_rule,&local_16b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16a8);
  if (!bVar1) {
    testing::Message::Message(&local_16b8);
    pMVar3 = testing::Message::operator<<(&local_16b8,(char (*) [28])"Photopic integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_16b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16a8);
  local_16d4 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_16d0,"photopic.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&photopic.integration_rule.k,&local_16d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16d0);
  if (!bVar1) {
    testing::Message::Message(&local_16e0);
    pMVar3 = testing::Message::operator<<
                       (&local_16e0,(char (*) [33])"Photopic minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_16e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16d0);
  local_1700 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_16f8,"photopic.min_wavelength.value","0.38",
             (double *)&photopic.min_wavelength,&local_1700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f8);
  if (!bVar1) {
    testing::Message::Message(&local_1708);
    pMVar3 = testing::Message::operator<<
                       (&local_1708,(char (*) [34])"Photopic minimum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_16f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_1708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f8);
  local_1724 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_1720,"photopic.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&photopic.min_wavelength.value,&local_1724);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1720);
  if (!bVar1) {
    testing::Message::Message(&local_1730);
    pMVar3 = testing::Message::operator<<
                       (&local_1730,(char (*) [33])"Photopic maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_1730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1720);
  local_1750 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1748,"photopic.max_wavelength.value","0.78",
             (double *)&photopic.max_wavelength,&local_1750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1748);
  if (!bVar1) {
    testing::Message::Message(&local_1758);
    pMVar3 = testing::Message::operator<<
                       (&local_1758,(char (*) [34])"Photopic maximum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_1758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1748);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[15],_nullptr>
            ((EqHelper *)local_1770,"tristim_x.name","\"COLOR_TRISTIMX\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
             (char (*) [15])"COLOR_TRISTIMX");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1770);
  if (!bVar1) {
    testing::Message::Message(&local_1778);
    pMVar3 = testing::Message::operator<<(&local_1778,(char (*) [22])"Tristim X method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_1778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1770);
  local_1794 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_1790,"tristim_x.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(tristim_x.description.field_2._M_local_buf + 8),&local_1794);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1790);
  if (!bVar1) {
    testing::Message::Message(&local_17a0);
    pMVar3 = testing::Message::operator<<
                       (&local_17a0,(char (*) [31])"Tristim X source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_17a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1790);
  local_17c0 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tristim_x.source_spectrum.b);
  local_17c4 = 0x213;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_17b8,"tristim_x.source_spectrum.values.size()","531",&local_17c0,
             &local_17c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
  if (!bVar1) {
    testing::Message::Message(&local_17d0);
    pMVar3 = testing::Message::operator<<
                       (&local_17d0,(char (*) [43])"Tristim_x source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_17b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tristim_x_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tristim_x_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tristim_x_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_17d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
  local_17f0 = 0.3;
  tristim_x_source_expected_last_wavelength.second = 0.0341;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_17e8,&local_17f0,
             &tristim_x_source_expected_last_wavelength.second);
  local_1810 = 0.83;
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x404e280000000000;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1808,&local_1810,(double *)&gtest_ar__6.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_x.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_1828,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1828);
  if (!bVar1) {
    testing::Message::Message(&local_1830);
    pMVar3 = testing::Message::operator<<
                       (&local_1830,(char (*) [38])"Tristim_x source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1828,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.source_spectrum.values[0], tristim_x_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__7.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1838,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1838);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1828);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_x.source_spectrum.b,0x212);
  PAIR_NEAR((pair<double,_double> *)local_1868,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1868);
  if (!bVar1) {
    testing::Message::Message(&local_1870);
    pMVar3 = testing::Message::operator<<
                       (&local_1870,(char (*) [37])"Tristim_x source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_33.message_,(internal *)local_1868,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.source_spectrum.values[530], tristim_x_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_33.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1878,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1878);
    std::__cxx11::string::~string((string *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_1870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1868);
  local_18ac = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_18a8,"tristim_x.detector_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)
             &tristim_x.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_18ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18a8);
  if (!bVar1) {
    testing::Message::Message(&local_18b8);
    pMVar3 = testing::Message::operator<<
                       (&local_18b8,(char (*) [33])"Tristim_x detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_18b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18a8);
  local_18d8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tristim_x.detector_spectrum.b);
  local_18dc = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_18d0,"tristim_x.detector_spectrum.values.size()","81",&local_18d8,
             &local_18dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18d0);
  if (!bVar1) {
    testing::Message::Message(&local_18e8);
    pMVar3 = testing::Message::operator<<
                       (&local_18e8,(char (*) [45])"Tristim_x detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tristim_x_detector_expected_first_nonzero_wavelength.second,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tristim_x_detector_expected_first_nonzero_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tristim_x_detector_expected_first_nonzero_wavelength.second);
    testing::Message::~Message(&local_18e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18d0);
  local_1908 = 0.38;
  tristim_x_detector_expected_last_nonzero_wavelength.second = 0.0002;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1900,&local_1908,
             &tristim_x_detector_expected_last_nonzero_wavelength.second);
  local_1928 = 0.77;
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f1a36e2eb1c432d;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1920,&local_1928,(double *)&gtest_ar__8.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_x.detector_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_1940,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1940);
  if (!bVar1) {
    testing::Message::Message(&local_1948);
    pMVar3 = testing::Message::operator<<
                       (&local_1948,(char (*) [48])"Tristim_x detector spectrum first nonzero point"
                       );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_1940,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.detector_spectrum.values[0], tristim_x_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__9.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1950,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1950);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1940);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_x.detector_spectrum.b,0x4e);
  PAIR_NEAR((pair<double,_double> *)local_1980,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1980);
  if (!bVar1) {
    testing::Message::Message(&local_1988);
    pMVar3 = testing::Message::operator<<
                       (&local_1988,(char (*) [47])"Tristim_x detector spectrum last nonzero point")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_35.message_,(internal *)local_1980,
               (AssertionResult *)
               "PAIR_NEAR(tristim_x.detector_spectrum.values[78], tristim_x_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_35.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1990,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1990);
    std::__cxx11::string::~string((string *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_1988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1980);
  local_19c4 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_19c0,"tristim_x.wavelength_set.type","Wavelength_Set_Type::FILE",
             (Wavelength_Set_Type *)
             &tristim_x.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_19c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19c0);
  if (!bVar1) {
    testing::Message::Message(&local_19d0);
    pMVar3 = testing::Message::operator<<
                       (&local_19d0,(char (*) [30])"Tristim_x wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_19c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_19d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19c0);
  local_19f0 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&tristim_x.wavelength_set.description.field_2 + 8));
  local_19f4 = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_19e8,"tristim_x.wavelength_set.values.size()","81",&local_19f0,
             &local_19f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19e8);
  if (!bVar1) {
    testing::Message::Message(&local_1a00);
    pMVar3 = testing::Message::operator<<
                       (&local_1a00,(char (*) [42])"Tristim_x wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_19e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_1a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19e8);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&tristim_x.wavelength_set.description.field_2 + 8),0);
  local_1a20 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1a18,"tristim_x.wavelength_set.values[0]","0.38",pvVar6,&local_1a20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a18);
  if (!bVar1) {
    testing::Message::Message(&local_1a28);
    pMVar3 = testing::Message::operator<<
                       (&local_1a28,(char (*) [37])"Tristim_x wavelength set first point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_1a28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a18);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&tristim_x.wavelength_set.description.field_2 + 8),0x50);
  local_1a48 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1a40,"tristim_x.wavelength_set.values[80]","0.78",pvVar6,&local_1a48)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a40);
  if (!bVar1) {
    testing::Message::Message(&local_1a50);
    pMVar3 = testing::Message::operator<<
                       (&local_1a50,(char (*) [36])"Tristim_x wavelength set last point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_1a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a40);
  local_1a6c = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_1a68,"tristim_x.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",
             (Integration_Rule_Type *)
             &tristim_x.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a68);
  if (!bVar1) {
    testing::Message::Message(&local_1a78);
    pMVar3 = testing::Message::operator<<
                       (&local_1a78,(char (*) [32])"Tristim_x integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_1a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a68);
  local_1a98 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1a90,"tristim_x.integration_rule.k","1.0",
             (double *)&tristim_x.integration_rule,&local_1a98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a90);
  if (!bVar1) {
    testing::Message::Message(&local_1aa0);
    pMVar3 = testing::Message::operator<<(&local_1aa0,(char (*) [29])"Tristim_x integration rule k")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_1aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a90);
  local_1abc = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_1ab8,"tristim_x.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tristim_x.integration_rule.k,&local_1abc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ab8);
  if (!bVar1) {
    testing::Message::Message(&local_1ac8);
    pMVar3 = testing::Message::operator<<
                       (&local_1ac8,(char (*) [34])"Tristim_x minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_1ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ab8);
  local_1ae8 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1ae0,"tristim_x.min_wavelength.value","0.38",
             (double *)&tristim_x.min_wavelength,&local_1ae8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ae0);
  if (!bVar1) {
    testing::Message::Message(&local_1af0);
    pMVar3 = testing::Message::operator<<
                       (&local_1af0,(char (*) [35])"Tristim_x minimum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ae0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_1af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ae0);
  local_1b0c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_1b08,"tristim_x.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tristim_x.min_wavelength.value,&local_1b0c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b08);
  if (!bVar1) {
    testing::Message::Message(&local_1b18);
    pMVar3 = testing::Message::operator<<
                       (&local_1b18,(char (*) [34])"Tristim_x maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_1b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b08);
  local_1b38 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1b30,"tristim_x.max_wavelength.value","0.78",
             (double *)&tristim_x.max_wavelength,&local_1b38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b30);
  if (!bVar1) {
    testing::Message::Message(&local_1b40);
    pMVar3 = testing::Message::operator<<
                       (&local_1b40,(char (*) [35])"Tristim_x maximum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_1b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b30);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[15],_nullptr>
            ((EqHelper *)local_1b58,"tristim_y.name","\"COLOR_TRISTIMY\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748,
             (char (*) [15])"COLOR_TRISTIMY");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b58);
  if (!bVar1) {
    testing::Message::Message(&local_1b60);
    pMVar3 = testing::Message::operator<<(&local_1b60,(char (*) [22])"Tristim Y method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_1b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b58);
  local_1b7c = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_1b78,"tristim_y.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(tristim_y.description.field_2._M_local_buf + 8),&local_1b7c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b78);
  if (!bVar1) {
    testing::Message::Message(&local_1b88);
    pMVar3 = testing::Message::operator<<
                       (&local_1b88,(char (*) [31])"Tristim Y source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_1b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b78);
  local_1ba8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tristim_y.source_spectrum.b);
  local_1bac = 0x213;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1ba0,"tristim_y.source_spectrum.values.size()","531",&local_1ba8,
             &local_1bac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ba0);
  if (!bVar1) {
    testing::Message::Message(&local_1bb8);
    pMVar3 = testing::Message::operator<<
                       (&local_1bb8,(char (*) [43])"Tristim_y source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tristim_y_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tristim_y_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tristim_y_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_1bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ba0);
  local_1bd8 = 0.3;
  tristim_y_source_expected_last_wavelength.second = 0.0341;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1bd0,&local_1bd8,
             &tristim_y_source_expected_last_wavelength.second);
  local_1bf8 = 0.83;
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x404e280000000000;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1bf0,&local_1bf8,(double *)&gtest_ar__10.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_y.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_1c10,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c10);
  if (!bVar1) {
    testing::Message::Message(&local_1c18);
    pMVar3 = testing::Message::operator<<
                       (&local_1c18,(char (*) [38])"Tristim_y source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_1c10,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.source_spectrum.values[0], tristim_y_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__11.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c20,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1c20);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_1c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c10);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_y.source_spectrum.b,0x212);
  PAIR_NEAR((pair<double,_double> *)local_1c50,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c50);
  if (!bVar1) {
    testing::Message::Message(&local_1c58);
    pMVar3 = testing::Message::operator<<
                       (&local_1c58,(char (*) [37])"Tristim_y source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_48.message_,(internal *)local_1c50,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.source_spectrum.values[530], tristim_y_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_48.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c60,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1c60);
    std::__cxx11::string::~string((string *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_1c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c50);
  local_1c94 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_1c90,"tristim_y.detector_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)
             &tristim_y.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c90);
  if (!bVar1) {
    testing::Message::Message(&local_1ca0);
    pMVar3 = testing::Message::operator<<
                       (&local_1ca0,(char (*) [33])"Tristim_y detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_1ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c90);
  local_1cc0 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tristim_y.detector_spectrum.b);
  local_1cc4 = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1cb8,"tristim_y.detector_spectrum.values.size()","81",&local_1cc0,
             &local_1cc4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cb8);
  if (!bVar1) {
    testing::Message::Message(&local_1cd0);
    pMVar3 = testing::Message::operator<<
                       (&local_1cd0,(char (*) [45])"Tristim_y detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tristim_y_detector_expected_first_nonzero_wavelength.second,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tristim_y_detector_expected_first_nonzero_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tristim_y_detector_expected_first_nonzero_wavelength.second);
    testing::Message::~Message(&local_1cd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cb8);
  local_1cf0 = 0.385;
  tristim_y_detector_expected_last_nonzero_wavelength.second = 0.0001;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1ce8,&local_1cf0,
             &tristim_y_detector_expected_last_nonzero_wavelength.second);
  local_1d10 = 0.755;
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f1a36e2eb1c432d;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1d08,&local_1d10,(double *)&gtest_ar__12.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_y.detector_spectrum.b,1);
  PAIR_NEAR((pair<double,_double> *)local_1d28,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d28);
  if (!bVar1) {
    testing::Message::Message(&local_1d30);
    pMVar3 = testing::Message::operator<<
                       (&local_1d30,(char (*) [48])"Tristim_y detector spectrum first nonzero point"
                       );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_1d28,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.detector_spectrum.values[1], tristim_y_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__13.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d38,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d38);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_1d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d28);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_y.detector_spectrum.b,0x4b);
  PAIR_NEAR((pair<double,_double> *)local_1d68,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d68);
  if (!bVar1) {
    testing::Message::Message(&local_1d70);
    pMVar3 = testing::Message::operator<<
                       (&local_1d70,(char (*) [47])"Tristim_y detector spectrum last nonzero point")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_50.message_,(internal *)local_1d68,
               (AssertionResult *)
               "PAIR_NEAR(tristim_y.detector_spectrum.values[75], tristim_y_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_50.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d78,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1d78);
    std::__cxx11::string::~string((string *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_1d70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d68);
  local_1dac = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_1da8,"tristim_y.wavelength_set.type","Wavelength_Set_Type::FILE",
             (Wavelength_Set_Type *)
             &tristim_y.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1dac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1da8);
  if (!bVar1) {
    testing::Message::Message(&local_1db8);
    pMVar3 = testing::Message::operator<<
                       (&local_1db8,(char (*) [30])"Tristim_y wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1da8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_1db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1da8);
  local_1dd8 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&tristim_y.wavelength_set.description.field_2 + 8));
  local_1ddc = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1dd0,"tristim_y.wavelength_set.values.size()","81",&local_1dd8,
             &local_1ddc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dd0);
  if (!bVar1) {
    testing::Message::Message(&local_1de8);
    pMVar3 = testing::Message::operator<<
                       (&local_1de8,(char (*) [42])"Tristim_y wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_1de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dd0);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&tristim_y.wavelength_set.description.field_2 + 8),0);
  local_1e08 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1e00,"tristim_y.wavelength_set.values[0]","0.38",pvVar6,&local_1e08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e00);
  if (!bVar1) {
    testing::Message::Message(&local_1e10);
    pMVar3 = testing::Message::operator<<
                       (&local_1e10,(char (*) [37])"Tristim_y wavelength set first point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_1e10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e00);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&tristim_y.wavelength_set.description.field_2 + 8),0x50);
  local_1e30 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1e28,"tristim_y.wavelength_set.values[80]","0.78",pvVar6,&local_1e30)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e28);
  if (!bVar1) {
    testing::Message::Message(&local_1e38);
    pMVar3 = testing::Message::operator<<
                       (&local_1e38,(char (*) [36])"Tristim_y wavelength set last point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_1e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e28);
  local_1e54 = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_1e50,"tristim_y.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",
             (Integration_Rule_Type *)
             &tristim_y.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e50);
  if (!bVar1) {
    testing::Message::Message(&local_1e60);
    pMVar3 = testing::Message::operator<<
                       (&local_1e60,(char (*) [32])"Tristim_y integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(&local_1e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e50);
  local_1e80 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1e78,"tristim_y.integration_rule.k","1.0",
             (double *)&tristim_y.integration_rule,&local_1e80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e78);
  if (!bVar1) {
    testing::Message::Message(&local_1e88);
    pMVar3 = testing::Message::operator<<(&local_1e88,(char (*) [29])"Tristim_y integration rule k")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_1e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e78);
  local_1ea4 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_1ea0,"tristim_y.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tristim_y.integration_rule.k,&local_1ea4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ea0);
  if (!bVar1) {
    testing::Message::Message(&local_1eb0);
    pMVar3 = testing::Message::operator<<
                       (&local_1eb0,(char (*) [34])"Tristim_y minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ea0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_1eb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ea0);
  local_1ed0 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1ec8,"tristim_y.min_wavelength.value","0.38",
             (double *)&tristim_y.min_wavelength,&local_1ed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ec8);
  if (!bVar1) {
    testing::Message::Message(&local_1ed8);
    pMVar3 = testing::Message::operator<<
                       (&local_1ed8,(char (*) [35])"Tristim_y minimum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ec8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_1ed8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ec8);
  local_1ef4 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_1ef0,"tristim_y.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tristim_y.min_wavelength.value,&local_1ef4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ef0);
  if (!bVar1) {
    testing::Message::Message(&local_1f00);
    pMVar3 = testing::Message::operator<<
                       (&local_1f00,(char (*) [34])"Tristim_y maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1ef0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(&local_1f00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ef0);
  local_1f20 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1f18,"tristim_y.max_wavelength.value","0.78",
             (double *)&tristim_y.max_wavelength,&local_1f20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f18);
  if (!bVar1) {
    testing::Message::Message(&local_1f28);
    pMVar3 = testing::Message::operator<<
                       (&local_1f28,(char (*) [35])"Tristim_y maximum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(&local_1f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f18);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[15],_nullptr>
            ((EqHelper *)local_1f40,"tristim_z.name","\"COLOR_TRISTIMZ\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d0,
             (char (*) [15])"COLOR_TRISTIMZ");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f40);
  if (!bVar1) {
    testing::Message::Message(&local_1f48);
    pMVar3 = testing::Message::operator<<(&local_1f48,(char (*) [22])"Tristim Z method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(&local_1f48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f40);
  local_1f64 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_1f60,"tristim_z.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(tristim_z.description.field_2._M_local_buf + 8),&local_1f64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f60);
  if (!bVar1) {
    testing::Message::Message(&local_1f70);
    pMVar3 = testing::Message::operator<<
                       (&local_1f70,(char (*) [31])"Tristim Z source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_62.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_62.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_62.message_);
    testing::Message::~Message(&local_1f70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f60);
  local_1f90 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tristim_z.source_spectrum.b);
  local_1f94 = 0x213;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1f88,"tristim_z.source_spectrum.values.size()","531",&local_1f90,
             &local_1f94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f88);
  if (!bVar1) {
    testing::Message::Message(&local_1fa0);
    pMVar3 = testing::Message::operator<<
                       (&local_1fa0,(char (*) [43])"Tristim_z source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tristim_z_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tristim_z_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tristim_z_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_1fa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f88);
  local_1fc0 = 0.3;
  tristim_z_source_expected_last_wavelength.second = 0.0341;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1fb8,&local_1fc0,
             &tristim_z_source_expected_last_wavelength.second);
  local_1fe0 = 0.83;
  gtest_ar__14.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x404e280000000000;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_1fd8,&local_1fe0,(double *)&gtest_ar__14.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_z.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_1ff8,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ff8);
  if (!bVar1) {
    testing::Message::Message(&local_2000);
    pMVar3 = testing::Message::operator<<
                       (&local_2000,(char (*) [38])"Tristim_z source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_1ff8,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.source_spectrum.values[0], tristim_z_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__15.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2008,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2008,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2008);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_2000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ff8);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_z.source_spectrum.b,0x212);
  PAIR_NEAR((pair<double,_double> *)local_2038,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2038);
  if (!bVar1) {
    testing::Message::Message(&local_2040);
    pMVar3 = testing::Message::operator<<
                       (&local_2040,(char (*) [37])"Tristim_z source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_63.message_,(internal *)local_2038,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.source_spectrum.values[530], tristim_z_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_63.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2048,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2048,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2048);
    std::__cxx11::string::~string((string *)&gtest_ar_63.message_);
    testing::Message::~Message(&local_2040);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2038);
  local_207c = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2078,"tristim_z.detector_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)
             &tristim_z.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_207c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2078);
  if (!bVar1) {
    testing::Message::Message(&local_2088);
    pMVar3 = testing::Message::operator<<
                       (&local_2088,(char (*) [33])"Tristim_z detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2078);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(&local_2088);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2078);
  local_20a8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tristim_z.detector_spectrum.b);
  local_20ac = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_20a0,"tristim_z.detector_spectrum.values.size()","81",&local_20a8,
             &local_20ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20a0);
  if (!bVar1) {
    testing::Message::Message(&local_20b8);
    pMVar3 = testing::Message::operator<<
                       (&local_20b8,(char (*) [45])"Tristim_z detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tristim_z_detector_expected_first_nonzero_wavelength.second,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tristim_z_detector_expected_first_nonzero_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tristim_z_detector_expected_first_nonzero_wavelength.second);
    testing::Message::~Message(&local_20b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20a0);
  local_20d8 = 0.38;
  tristim_z_detector_expected_last_nonzero_wavelength.second = 0.0007;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_20d0,&local_20d8,
             &tristim_z_detector_expected_last_nonzero_wavelength.second);
  local_20f8 = 0.555;
  gtest_ar__16.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f5205bc01a36e2f;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_20f0,&local_20f8,(double *)&gtest_ar__16.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_z.detector_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_2110,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2110);
  if (!bVar1) {
    testing::Message::Message(&local_2118);
    pMVar3 = testing::Message::operator<<
                       (&local_2118,(char (*) [48])"Tristim_z detector spectrum first nonzero point"
                       );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_2110,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.detector_spectrum.values[0], tristim_z_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__17.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2120,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2120);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_2118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2110);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tristim_z.detector_spectrum.b,0x23);
  PAIR_NEAR((pair<double,_double> *)local_2150,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2150);
  if (!bVar1) {
    testing::Message::Message(&local_2158);
    pMVar3 = testing::Message::operator<<
                       (&local_2158,(char (*) [47])"Tristim_z detector spectrum last nonzero point")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_65.message_,(internal *)local_2150,
               (AssertionResult *)
               "PAIR_NEAR(tristim_z.detector_spectrum.values[35], tristim_z_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_65.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2160,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2160);
    std::__cxx11::string::~string((string *)&gtest_ar_65.message_);
    testing::Message::~Message(&local_2158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2150);
  local_2194 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_2190,"tristim_z.wavelength_set.type","Wavelength_Set_Type::FILE",
             (Wavelength_Set_Type *)
             &tristim_z.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2194);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2190);
  if (!bVar1) {
    testing::Message::Message(&local_21a0);
    pMVar3 = testing::Message::operator<<
                       (&local_21a0,(char (*) [30])"Tristim_z wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(&local_21a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2190);
  local_21c0 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&tristim_z.wavelength_set.description.field_2 + 8));
  local_21c4 = 0x51;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_21b8,"tristim_z.wavelength_set.values.size()","81",&local_21c0,
             &local_21c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21b8);
  if (!bVar1) {
    testing::Message::Message(&local_21d0);
    pMVar3 = testing::Message::operator<<
                       (&local_21d0,(char (*) [42])"Tristim_z wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_21b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_67.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_67.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_67.message_);
    testing::Message::~Message(&local_21d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_21b8);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&tristim_z.wavelength_set.description.field_2 + 8),0);
  local_21f0 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_21e8,"tristim_z.wavelength_set.values[0]","0.38",pvVar6,&local_21f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_21e8);
  if (!bVar1) {
    testing::Message::Message(&local_21f8);
    pMVar3 = testing::Message::operator<<
                       (&local_21f8,(char (*) [37])"Tristim_z wavelength set first point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_21e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_68.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_68.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_68.message_);
    testing::Message::~Message(&local_21f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_21e8);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      ((long)&tristim_z.wavelength_set.description.field_2 + 8),0x50);
  local_2218 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2210,"tristim_z.wavelength_set.values[80]","0.78",pvVar6,&local_2218)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2210);
  if (!bVar1) {
    testing::Message::Message(&local_2220);
    pMVar3 = testing::Message::operator<<
                       (&local_2220,(char (*) [36])"Tristim_z wavelength set last point");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(&local_2220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2210);
  local_223c = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_2238,"tristim_z.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",
             (Integration_Rule_Type *)
             &tristim_z.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_223c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2238);
  if (!bVar1) {
    testing::Message::Message(&local_2248);
    pMVar3 = testing::Message::operator<<
                       (&local_2248,(char (*) [32])"Tristim_z integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(&local_2248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2238);
  local_2268 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2260,"tristim_z.integration_rule.k","1.0",
             (double *)&tristim_z.integration_rule,&local_2268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2260);
  if (!bVar1) {
    testing::Message::Message(&local_2270);
    pMVar3 = testing::Message::operator<<(&local_2270,(char (*) [29])"Tristim_z integration rule k")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(&local_2270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2260);
  local_228c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2288,"tristim_z.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tristim_z.integration_rule.k,&local_228c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2288);
  if (!bVar1) {
    testing::Message::Message(&local_2298);
    pMVar3 = testing::Message::operator<<
                       (&local_2298,(char (*) [34])"Tristim_z minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
    testing::Message::~Message(&local_2298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2288);
  local_22b8 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_22b0,"tristim_z.min_wavelength.value","0.38",
             (double *)&tristim_z.min_wavelength,&local_22b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22b0);
  if (!bVar1) {
    testing::Message::Message(&local_22c0);
    pMVar3 = testing::Message::operator<<
                       (&local_22c0,(char (*) [35])"Tristim_z minimum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_22b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_73.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_73.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_73.message_);
    testing::Message::~Message(&local_22c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22b0);
  local_22dc = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_22d8,"tristim_z.max_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tristim_z.min_wavelength.value,&local_22dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22d8);
  if (!bVar1) {
    testing::Message::Message(&local_22e8);
    pMVar3 = testing::Message::operator<<
                       (&local_22e8,(char (*) [34])"Tristim_z maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_22d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_74.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_74.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_74.message_);
    testing::Message::~Message(&local_22e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22d8);
  local_2308 = 0.78;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2300,"tristim_z.max_wavelength.value","0.78",
             (double *)&tristim_z.max_wavelength,&local_2308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2300);
  if (!bVar1) {
    testing::Message::Message(&local_2310);
    pMVar3 = testing::Message::operator<<
                       (&local_2310,(char (*) [35])"Tristim_z maximum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_75.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_75.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_75.message_);
    testing::Message::~Message(&local_2310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2300);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[11],_nullptr>
            ((EqHelper *)local_2328,"thermal_ir.name","\"THERMAL IR\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a58,
             (char (*) [11])"THERMAL IR");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2328);
  if (!bVar1) {
    testing::Message::Message(&local_2330);
    pMVar3 = testing::Message::operator<<(&local_2330,(char (*) [23])"Thermal IR method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_76.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_76.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_76.message_);
    testing::Message::~Message(&local_2330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2328);
  local_234c = BLACKBODY;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2348,"thermal_ir.source_spectrum.type","Spectrum_Type::BLACKBODY",
             (Spectrum_Type *)(thermal_ir.description.field_2._M_local_buf + 8),&local_234c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2348);
  if (!bVar1) {
    testing::Message::Message(&local_2358);
    pMVar3 = testing::Message::operator<<
                       (&local_2358,(char (*) [32])"Thermal_IR source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_77.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_77.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_77.message_);
    testing::Message::~Message(&local_2358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2348);
  local_2378 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&thermal_ir.source_spectrum.b);
  local_237c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2370,"thermal_ir.source_spectrum.values.size()","0",&local_2378,
             &local_237c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2370);
  if (!bVar1) {
    testing::Message::Message(&local_2388);
    pMVar3 = testing::Message::operator<<
                       (&local_2388,(char (*) [44])"Thermal_IR source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_78.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_78.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_78.message_);
    testing::Message::~Message(&local_2388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2370);
  local_23a4 = 300;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_23a0,"thermal_ir.source_spectrum.t","300",
             (double *)((long)&thermal_ir.source_spectrum.description.field_2 + 8),&local_23a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23a0);
  if (!bVar1) {
    testing::Message::Message(&local_23b0);
    pMVar3 = testing::Message::operator<<(&local_23b0,(char (*) [29])"Thermal_IR source spectrum t")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_23a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_79.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_79.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_79.message_);
    testing::Message::~Message(&local_23b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23a0);
  local_23cc = NONE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_23c8,"thermal_ir.detector_spectrum.type","Spectrum_Type::NONE",
             (Spectrum_Type *)
             &thermal_ir.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_23cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23c8);
  if (!bVar1) {
    testing::Message::Message(&local_23d8);
    pMVar3 = testing::Message::operator<<
                       (&local_23d8,(char (*) [34])"Thermal_IR detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_23c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_80.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_80.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_80.message_);
    testing::Message::~Message(&local_23d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23c8);
  local_23f8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&thermal_ir.detector_spectrum.b);
  local_23fc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_23f0,"thermal_ir.detector_spectrum.values.size()","0",&local_23f8,
             &local_23fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23f0);
  if (!bVar1) {
    testing::Message::Message(&local_2408);
    pMVar3 = testing::Message::operator<<
                       (&local_2408,(char (*) [46])"Thermal_IR detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_81.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_81.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_81.message_);
    testing::Message::~Message(&local_2408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23f0);
  local_2424 = DATA;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_2420,"thermal_ir.wavelength_set.type","Wavelength_Set_Type::DATA",
             (Wavelength_Set_Type *)
             &thermal_ir.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2424);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2420);
  if (!bVar1) {
    testing::Message::Message(&local_2430);
    pMVar3 = testing::Message::operator<<
                       (&local_2430,(char (*) [31])"Thermal_IR wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_82.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_82.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_82.message_);
    testing::Message::~Message(&local_2430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2420);
  local_2450 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&thermal_ir.wavelength_set.description.field_2 + 8));
  local_2454 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2448,"thermal_ir.wavelength_set.values.size()","0",&local_2450,
             &local_2454);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2448);
  if (!bVar1) {
    testing::Message::Message(&local_2460);
    pMVar3 = testing::Message::operator<<
                       (&local_2460,(char (*) [43])"Thermal_IR wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_83.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_83.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_83.message_);
    testing::Message::~Message(&local_2460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2448);
  local_247c = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_2478,"thermal_ir.integration_rule.type",
             "Integration_Rule_Type::TRAPEZOIDAL",
             (Integration_Rule_Type *)
             &thermal_ir.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_247c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2478);
  if (!bVar1) {
    testing::Message::Message(&local_2488);
    pMVar3 = testing::Message::operator<<
                       (&local_2488,(char (*) [33])"Thermal_IR integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_84.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_84.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_84.message_);
    testing::Message::~Message(&local_2488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2478);
  local_24a8 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_24a0,"thermal_ir.integration_rule.k","1.0",
             (double *)&thermal_ir.integration_rule,&local_24a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24a0);
  if (!bVar1) {
    testing::Message::Message(&local_24b0);
    pMVar3 = testing::Message::operator<<
                       (&local_24b0,(char (*) [30])"Thermal_IR integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_24a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_85.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_85.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_85.message_);
    testing::Message::~Message(&local_24b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_24a0);
  local_24cc = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_24c8,"thermal_ir.min_wavelength.type",
             "Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&thermal_ir.integration_rule.k,&local_24cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24c8);
  if (!bVar1) {
    testing::Message::Message(&local_24d8);
    pMVar3 = testing::Message::operator<<
                       (&local_24d8,(char (*) [35])"Thermal_IR minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_24c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_86.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_86.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_86.message_);
    testing::Message::~Message(&local_24d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_24c8);
  local_24f8 = 5.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_24f0,"thermal_ir.min_wavelength.value","5.0",
             (double *)&thermal_ir.min_wavelength,&local_24f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24f0);
  if (!bVar1) {
    testing::Message::Message(&local_2500);
    pMVar3 = testing::Message::operator<<
                       (&local_2500,(char (*) [36])"Thermal_IR minimum wavelength value");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_24f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_87.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_87.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_87.message_);
    testing::Message::~Message(&local_2500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_24f0);
  local_251c = WAVELENGTH_SET;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2518,"thermal_ir.max_wavelength.type",
             "Wavelength_Boundary_Type::WAVELENGTH_SET",
             (Wavelength_Boundary_Type *)&thermal_ir.min_wavelength.value,&local_251c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2518);
  if (!bVar1) {
    testing::Message::Message(&local_2528);
    pMVar3 = testing::Message::operator<<
                       (&local_2528,(char (*) [35])"Thermal_IR maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_88.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_88.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_88.message_);
    testing::Message::~Message(&local_2528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2518);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_2540,"tuv.name","\"TUV\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be0,
             (char (*) [4])"TUV");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2540);
  if (!bVar1) {
    testing::Message::Message(&local_2548);
    pMVar3 = testing::Message::operator<<(&local_2548,(char (*) [16])"TUV method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_89.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_89.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_89.message_);
    testing::Message::~Message(&local_2548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2540);
  local_2564 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2560,"tuv.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(tuv.description.field_2._M_local_buf + 8),&local_2564);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2560);
  if (!bVar1) {
    testing::Message::Message(&local_2570);
    pMVar3 = testing::Message::operator<<(&local_2570,(char (*) [25])"TUV source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_90.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_90.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_90.message_);
    testing::Message::~Message(&local_2570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2560);
  local_2590 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tuv.source_spectrum.b);
  local_2594 = 0x79;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2588,"tuv.source_spectrum.values.size()","121",&local_2590,
             &local_2594);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2588);
  if (!bVar1) {
    testing::Message::Message(&local_25a0);
    pMVar3 = testing::Message::operator<<
                       (&local_25a0,(char (*) [37])"TUV source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tuv_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tuv_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tuv_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_25a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2588);
  local_25c0 = 0.3;
  tuv_source_expected_last_wavelength.second = 0.0;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_25b8,&local_25c0,
             &tuv_source_expected_last_wavelength.second);
  local_25e0 = 4.045;
  gtest_ar__18.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x401b99999999999a;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_25d8,&local_25e0,(double *)&gtest_ar__18.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tuv.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_25f8,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_25f8);
  if (!bVar1) {
    testing::Message::Message(&local_2600);
    pMVar3 = testing::Message::operator<<
                       (&local_2600,(char (*) [32])"TUV source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_25f8,
               (AssertionResult *)
               "PAIR_NEAR(tuv.source_spectrum.values[0], tuv_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__19.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2608,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2608);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_2600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_25f8);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tuv.source_spectrum.b,0x78);
  PAIR_NEAR((pair<double,_double> *)local_2638,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2638);
  if (!bVar1) {
    testing::Message::Message(&local_2640);
    pMVar3 = testing::Message::operator<<
                       (&local_2640,(char (*) [31])"TUV source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_91.message_,(internal *)local_2638,
               (AssertionResult *)
               "PAIR_NEAR(tuv.source_spectrum.values[120], tuv_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_91.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2648,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2648);
    std::__cxx11::string::~string((string *)&gtest_ar_91.message_);
    testing::Message::~Message(&local_2640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2638);
  local_267c = NONE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2678,"tuv.detector_spectrum.type","Spectrum_Type::NONE",
             (Spectrum_Type *)
             &tuv.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_267c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2678);
  if (!bVar1) {
    testing::Message::Message(&local_2688);
    pMVar3 = testing::Message::operator<<(&local_2688,(char (*) [27])"TUV detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_92.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_92.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_92.message_);
    testing::Message::~Message(&local_2688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2678);
  local_26a4 = SOURCE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_26a0,"tuv.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             (Wavelength_Set_Type *)
             &tuv.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_26a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_26a0);
  if (!bVar1) {
    testing::Message::Message(&local_26b0);
    pMVar3 = testing::Message::operator<<(&local_26b0,(char (*) [24])"TUV wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_26a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_93.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xbf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_93.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_93.message_);
    testing::Message::~Message(&local_26b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_26a0);
  local_26d0 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&tuv.wavelength_set.description.field_2 + 8));
  local_26d4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_26c8,"tuv.wavelength_set.values.size()","0",&local_26d0,&local_26d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_26c8);
  if (!bVar1) {
    testing::Message::Message(&local_26e0);
    pMVar3 = testing::Message::operator<<
                       (&local_26e0,(char (*) [36])"TUV wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_26c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_94.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_94.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_94.message_);
    testing::Message::~Message(&local_26e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_26c8);
  local_26fc = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_26f8,"tuv.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,(Integration_Rule_Type *)
              &tuv.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,&local_26fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_26f8);
  if (!bVar1) {
    testing::Message::Message(&local_2708);
    pMVar3 = testing::Message::operator<<(&local_2708,(char (*) [26])"TUV integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_26f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_95.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_95.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_95.message_);
    testing::Message::~Message(&local_2708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_26f8);
  local_2728 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2720,"tuv.integration_rule.k","1.0",(double *)&tuv.integration_rule,
             &local_2728);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2720);
  if (!bVar1) {
    testing::Message::Message(&local_2730);
    pMVar3 = testing::Message::operator<<(&local_2730,(char (*) [23])"TUV integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_96.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_96.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_96.message_);
    testing::Message::~Message(&local_2730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2720);
  local_274c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2748,"tuv.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tuv.integration_rule.k,&local_274c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2748);
  if (!bVar1) {
    testing::Message::Message(&local_2758);
    pMVar3 = testing::Message::operator<<(&local_2758,(char (*) [28])"TUV minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_97.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_97.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_97.message_);
    testing::Message::~Message(&local_2758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2748);
  local_2778 = 0.31;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2770,"tuv.min_wavelength.value","0.31",(double *)&tuv.min_wavelength,
             &local_2778);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2770);
  if (!bVar1) {
    testing::Message::Message(&local_2780);
    pMVar3 = testing::Message::operator<<(&local_2780,(char (*) [29])"TUV minimum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_98.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_98.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_98.message_);
    testing::Message::~Message(&local_2780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2770);
  local_279c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2798,"tuv.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tuv.min_wavelength.value,&local_279c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2798);
  if (!bVar1) {
    testing::Message::Message(&local_27a8);
    pMVar3 = testing::Message::operator<<(&local_27a8,(char (*) [28])"TUV maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_99.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_99.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_99.message_);
    testing::Message::~Message(&local_27a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2798);
  local_27c8 = 0.38;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_27c0,"tuv.max_wavelength.value","0.38",(double *)&tuv.max_wavelength,
             &local_27c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_27c0);
  if (!bVar1) {
    testing::Message::Message(&local_27d0);
    pMVar3 = testing::Message::operator<<(&local_27d0,(char (*) [29])"TUV maximum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_27c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_100.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_100.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_100.message_);
    testing::Message::~Message(&local_27d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_27c0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_27e8,"spf.name","\"SPF\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d68,
             (char (*) [4])"SPF");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_27e8);
  if (!bVar1) {
    testing::Message::Message(&local_27f0);
    pMVar3 = testing::Message::operator<<(&local_27f0,(char (*) [16])"SPF method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_27e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_101.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,200,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_101.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_101.message_);
    testing::Message::~Message(&local_27f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_27e8);
  local_280c = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2808,"spf.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(spf.description.field_2._M_local_buf + 8),&local_280c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2808);
  if (!bVar1) {
    testing::Message::Message(&local_2818);
    pMVar3 = testing::Message::operator<<(&local_2818,(char (*) [25])"SPF source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_102.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_102.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_102.message_);
    testing::Message::~Message(&local_2818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2808);
  local_2838 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&spf.source_spectrum.b);
  local_283c = 0x3d;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2830,"spf.source_spectrum.values.size()","61",&local_2838,&local_283c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2830);
  if (!bVar1) {
    testing::Message::Message(&local_2848);
    pMVar3 = testing::Message::operator<<
                       (&local_2848,(char (*) [37])"SPF source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spf_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xca,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&spf_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&spf_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_2848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2830);
  local_2868 = 0.28;
  spf_source_expected_last_wavelength.second = 4.12e-11;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2860,&local_2868,
             &spf_source_expected_last_wavelength.second);
  local_2888 = 0.4;
  gtest_ar__20.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f1a79fec99f1ae3;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2880,&local_2888,(double *)&gtest_ar__20.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&spf.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_28a0,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28a0);
  if (!bVar1) {
    testing::Message::Message(&local_28a8);
    pMVar3 = testing::Message::operator<<
                       (&local_28a8,(char (*) [32])"SPF source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_28a0,
               (AssertionResult *)
               "PAIR_NEAR(spf.source_spectrum.values[0], spf_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__21.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_28b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28b0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_28b0);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_28a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28a0);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&spf.source_spectrum.b,0x3c);
  PAIR_NEAR((pair<double,_double> *)local_28e0,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28e0);
  if (!bVar1) {
    testing::Message::Message(&local_28e8);
    pMVar3 = testing::Message::operator<<
                       (&local_28e8,(char (*) [31])"SPF source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_103.message_,(internal *)local_28e0,
               (AssertionResult *)
               "PAIR_NEAR(spf.source_spectrum.values[60], spf_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_103.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_28f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28f0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_28f0);
    std::__cxx11::string::~string((string *)&gtest_ar_103.message_);
    testing::Message::~Message(&local_28e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28e0);
  local_2924 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2920,"spf.detector_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)
             &spf.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2924);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2920);
  if (!bVar1) {
    testing::Message::Message(&local_2930);
    pMVar3 = testing::Message::operator<<(&local_2930,(char (*) [27])"SPF detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2920);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_104.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_104.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_104.message_);
    testing::Message::~Message(&local_2930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2920);
  local_2950 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&spf.detector_spectrum.b);
  local_2954 = 0x3d;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2948,"spf.detector_spectrum.values.size()","61",&local_2950,
             &local_2954);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2948);
  if (!bVar1) {
    testing::Message::Message(&local_2960);
    pMVar3 = testing::Message::operator<<
                       (&local_2960,(char (*) [39])"SPF detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2948);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spf_detector_expected_first_nonzero_wavelength.second,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&spf_detector_expected_first_nonzero_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&spf_detector_expected_first_nonzero_wavelength.second);
    testing::Message::~Message(&local_2960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2948);
  local_2980 = 0.28;
  spf_detector_expected_last_nonzero_wavelength.second = 1.0;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2978,&local_2980,
             &spf_detector_expected_last_nonzero_wavelength.second);
  local_29a0 = 0.4;
  gtest_ar__22.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3f1ffb480a5accd5;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2998,&local_29a0,(double *)&gtest_ar__22.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&spf.detector_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_29b8,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29b8);
  if (!bVar1) {
    testing::Message::Message(&local_29c0);
    pMVar3 = testing::Message::operator<<
                       (&local_29c0,(char (*) [42])"SPF detector spectrum first nonzero point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_29b8,
               (AssertionResult *)
               "PAIR_NEAR(spf.detector_spectrum.values[0], spf_detector_expected_first_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__23.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_29c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_29c8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_29c8);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_29c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_29b8);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&spf.detector_spectrum.b,0x3c);
  PAIR_NEAR((pair<double,_double> *)local_29f8,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29f8);
  if (!bVar1) {
    testing::Message::Message(&local_2a00);
    pMVar3 = testing::Message::operator<<
                       (&local_2a00,(char (*) [41])"SPF detector spectrum last nonzero point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_105.message_,(internal *)local_29f8,
               (AssertionResult *)
               "PAIR_NEAR(spf.detector_spectrum.values[60], spf_detector_expected_last_nonzero_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_105.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a08,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2a08);
    std::__cxx11::string::~string((string *)&gtest_ar_105.message_);
    testing::Message::~Message(&local_2a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_29f8);
  local_2a3c = SOURCE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_2a38,"spf.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             (Wavelength_Set_Type *)
             &spf.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a38);
  if (!bVar1) {
    testing::Message::Message(&local_2a48);
    pMVar3 = testing::Message::operator<<(&local_2a48,(char (*) [24])"SPF wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_106.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_106.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_106.message_);
    testing::Message::~Message(&local_2a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a38);
  local_2a68 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&spf.wavelength_set.description.field_2 + 8));
  local_2a6c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2a60,"spf.wavelength_set.values.size()","0",&local_2a68,&local_2a6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a60);
  if (!bVar1) {
    testing::Message::Message(&local_2a78);
    pMVar3 = testing::Message::operator<<
                       (&local_2a78,(char (*) [36])"SPF wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_107.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_107.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_107.message_);
    testing::Message::~Message(&local_2a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a60);
  local_2a94 = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_2a90,"spf.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,(Integration_Rule_Type *)
              &spf.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,&local_2a94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a90);
  if (!bVar1) {
    testing::Message::Message(&local_2aa0);
    pMVar3 = testing::Message::operator<<(&local_2aa0,(char (*) [26])"SPF integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_108.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_108.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_108.message_);
    testing::Message::~Message(&local_2aa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a90);
  local_2ac0 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2ab8,"spf.integration_rule.k","1.0",(double *)&spf.integration_rule,
             &local_2ac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ab8);
  if (!bVar1) {
    testing::Message::Message(&local_2ac8);
    pMVar3 = testing::Message::operator<<(&local_2ac8,(char (*) [23])"SPF integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ab8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_109.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_109.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_109.message_);
    testing::Message::~Message(&local_2ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ab8);
  local_2ae4 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2ae0,"spf.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&spf.integration_rule.k,&local_2ae4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ae0);
  if (!bVar1) {
    testing::Message::Message(&local_2af0);
    pMVar3 = testing::Message::operator<<(&local_2af0,(char (*) [28])"SPF minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ae0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_110.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xd9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_110.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_110.message_);
    testing::Message::~Message(&local_2af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ae0);
  local_2b10 = 0.28;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2b08,"spf.min_wavelength.value","0.28",(double *)&spf.min_wavelength,
             &local_2b10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b08);
  if (!bVar1) {
    testing::Message::Message(&local_2b18);
    pMVar3 = testing::Message::operator<<(&local_2b18,(char (*) [29])"SPF minimum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_111.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_111.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_111.message_);
    testing::Message::~Message(&local_2b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b08);
  local_2b34 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2b30,"spf.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&spf.min_wavelength.value,&local_2b34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b30);
  if (!bVar1) {
    testing::Message::Message(&local_2b40);
    pMVar3 = testing::Message::operator<<(&local_2b40,(char (*) [28])"SPF maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_112.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_112.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_112.message_);
    testing::Message::~Message(&local_2b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b30);
  local_2b60 = 0.4;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2b58,"spf.max_wavelength.value","0.4",(double *)&spf.max_wavelength,
             &local_2b60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b58);
  if (!bVar1) {
    testing::Message::Message(&local_2b68);
    pMVar3 = testing::Message::operator<<(&local_2b68,(char (*) [29])"SPF maximum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_113.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_113.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_113.message_);
    testing::Message::~Message(&local_2b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b58);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_2b80,"tdw.name","\"TDW\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ef0,
             (char (*) [4])"TDW");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b80);
  if (!bVar1) {
    testing::Message::Message(&local_2b88);
    pMVar3 = testing::Message::operator<<(&local_2b88,(char (*) [16])"TDW method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_114.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_114.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_114.message_);
    testing::Message::~Message(&local_2b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b80);
  local_2ba4 = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2ba0,"tdw.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(tdw.description.field_2._M_local_buf + 8),&local_2ba4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ba0);
  if (!bVar1) {
    testing::Message::Message(&local_2bb0);
    pMVar3 = testing::Message::operator<<(&local_2bb0,(char (*) [25])"TDW source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_115.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_115.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_115.message_);
    testing::Message::~Message(&local_2bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ba0);
  local_2bd0 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tdw.source_spectrum.b);
  local_2bd4 = 0x79;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2bc8,"tdw.source_spectrum.values.size()","121",&local_2bd0,
             &local_2bd4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2bc8);
  if (!bVar1) {
    testing::Message::Message(&local_2be0);
    pMVar3 = testing::Message::operator<<
                       (&local_2be0,(char (*) [37])"TDW source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2bc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tdw_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tdw_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tdw_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_2be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2bc8);
  local_2c00 = 0.3;
  tdw_source_expected_last_wavelength.second = 0.0;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2bf8,&local_2c00,
             &tdw_source_expected_last_wavelength.second);
  local_2c20 = 4.045;
  gtest_ar__24.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x401b99999999999a;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2c18,&local_2c20,(double *)&gtest_ar__24.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tdw.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_2c38,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c38);
  if (!bVar1) {
    testing::Message::Message(&local_2c40);
    pMVar3 = testing::Message::operator<<
                       (&local_2c40,(char (*) [32])"TDW source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_2c38,
               (AssertionResult *)
               "PAIR_NEAR(tdw.source_spectrum.values[0], tdw_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__25.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c48,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2c48);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_2c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c38);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tdw.source_spectrum.b,0x78);
  PAIR_NEAR((pair<double,_double> *)local_2c78,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c78);
  if (!bVar1) {
    testing::Message::Message(&local_2c80);
    pMVar3 = testing::Message::operator<<
                       (&local_2c80,(char (*) [31])"TDW source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_116.message_,(internal *)local_2c78,
               (AssertionResult *)
               "PAIR_NEAR(tdw.source_spectrum.values[120], tdw_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_116.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2c88,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2c88);
    std::__cxx11::string::~string((string *)&gtest_ar_116.message_);
    testing::Message::~Message(&local_2c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c78);
  local_2cbc = UV_ACTION;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2cb8,"tdw.detector_spectrum.type","Spectrum_Type::UV_ACTION",
             (Spectrum_Type *)
             &tdw.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2cbc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2cb8);
  if (!bVar1) {
    testing::Message::Message(&local_2cc8);
    pMVar3 = testing::Message::operator<<(&local_2cc8,(char (*) [27])"TDW detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2cb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_117.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_117.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_117.message_);
    testing::Message::~Message(&local_2cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2cb8);
  local_2ce8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tdw.detector_spectrum.b);
  local_2cec = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2ce0,"tdw.detector_spectrum.values.size()","0",&local_2ce8,
             &local_2cec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ce0);
  if (!bVar1) {
    testing::Message::Message(&local_2cf8);
    pMVar3 = testing::Message::operator<<
                       (&local_2cf8,(char (*) [39])"TDW detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ce0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_118.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_118.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_118.message_);
    testing::Message::~Message(&local_2cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ce0);
  local_2d18 = 3.6;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2d10,"tdw.detector_spectrum.a","3.6",&tdw.detector_spectrum.t,
             &local_2d18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d10);
  if (!bVar1) {
    testing::Message::Message(&local_2d20);
    pMVar3 = testing::Message::operator<<(&local_2d20,(char (*) [24])"TDW detector spectrum a");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_119.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_119.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_119.message_);
    testing::Message::~Message(&local_2d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d10);
  local_2d3c = 0xc;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_2d38,"tdw.detector_spectrum.b","12",&tdw.detector_spectrum.a,
             &local_2d3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d38);
  if (!bVar1) {
    testing::Message::Message(&local_2d48);
    pMVar3 = testing::Message::operator<<(&local_2d48,(char (*) [24])"TDW detector spectrum b");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_120.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_120.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_120.message_);
    testing::Message::~Message(&local_2d48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d38);
  local_2d64 = SOURCE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_2d60,"tdw.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             (Wavelength_Set_Type *)
             &tdw.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d60);
  if (!bVar1) {
    testing::Message::Message(&local_2d70);
    pMVar3 = testing::Message::operator<<(&local_2d70,(char (*) [24])"TDW wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_121.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_121.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_121.message_);
    testing::Message::~Message(&local_2d70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d60);
  local_2d90 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&tdw.wavelength_set.description.field_2 + 8));
  local_2d94 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2d88,"tdw.wavelength_set.values.size()","0",&local_2d90,&local_2d94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d88);
  if (!bVar1) {
    testing::Message::Message(&local_2da0);
    pMVar3 = testing::Message::operator<<
                       (&local_2da0,(char (*) [36])"TDW wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_122.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_122.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_122.message_);
    testing::Message::~Message(&local_2da0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d88);
  local_2dbc = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_2db8,"tdw.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,(Integration_Rule_Type *)
              &tdw.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,&local_2dbc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2db8);
  if (!bVar1) {
    testing::Message::Message(&local_2dc8);
    pMVar3 = testing::Message::operator<<(&local_2dc8,(char (*) [26])"TDW integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2db8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_123.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_123.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_123.message_);
    testing::Message::~Message(&local_2dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2db8);
  local_2de8 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2de0,"tdw.integration_rule.k","1.0",(double *)&tdw.integration_rule,
             &local_2de8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2de0);
  if (!bVar1) {
    testing::Message::Message(&local_2df0);
    pMVar3 = testing::Message::operator<<(&local_2df0,(char (*) [23])"TDW integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2de0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_124.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_124.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_124.message_);
    testing::Message::~Message(&local_2df0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2de0);
  local_2e0c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2e08,"tdw.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tdw.integration_rule.k,&local_2e0c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e08);
  if (!bVar1) {
    testing::Message::Message(&local_2e18);
    pMVar3 = testing::Message::operator<<(&local_2e18,(char (*) [28])"TDW minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_125.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_125.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_125.message_);
    testing::Message::~Message(&local_2e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e08);
  local_2e38 = 0.3;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2e30,"tdw.min_wavelength.value","0.3",(double *)&tdw.min_wavelength,
             &local_2e38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e30);
  if (!bVar1) {
    testing::Message::Message(&local_2e40);
    pMVar3 = testing::Message::operator<<(&local_2e40,(char (*) [29])"TDW minimum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_126.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_126.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_126.message_);
    testing::Message::~Message(&local_2e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e30);
  local_2e5c = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_2e58,"tdw.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tdw.min_wavelength.value,&local_2e5c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e58);
  if (!bVar1) {
    testing::Message::Message(&local_2e68);
    pMVar3 = testing::Message::operator<<(&local_2e68,(char (*) [28])"TDW maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_127.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_127.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_127.message_);
    testing::Message::~Message(&local_2e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e58);
  local_2e88 = 0.7;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_2e80,"tdw.max_wavelength.value","0.7",(double *)&tdw.max_wavelength,
             &local_2e88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e80);
  if (!bVar1) {
    testing::Message::Message(&local_2e90);
    pMVar3 = testing::Message::operator<<(&local_2e90,(char (*) [29])"TDW maximum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_128.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_128.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_128.message_);
    testing::Message::~Message(&local_2e90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e80);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_2ea8,"tkr.name","\"TKR\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1078,
             (char (*) [4])"TKR");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ea8);
  if (!bVar1) {
    testing::Message::Message(&local_2eb0);
    pMVar3 = testing::Message::operator<<(&local_2eb0,(char (*) [16])"TKR method type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ea8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_129.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_129.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_129.message_);
    testing::Message::~Message(&local_2eb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ea8);
  local_2ecc = FILE;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2ec8,"tkr.source_spectrum.type","Spectrum_Type::FILE",
             (Spectrum_Type *)(tkr.description.field_2._M_local_buf + 8),&local_2ecc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ec8);
  if (!bVar1) {
    testing::Message::Message(&local_2ed8);
    pMVar3 = testing::Message::operator<<(&local_2ed8,(char (*) [25])"TKR source spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ec8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_130.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_130.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_130.message_);
    testing::Message::~Message(&local_2ed8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ec8);
  local_2ef8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tkr.source_spectrum.b);
  local_2efc = 0x79;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2ef0,"tkr.source_spectrum.values.size()","121",&local_2ef8,
             &local_2efc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ef0);
  if (!bVar1) {
    testing::Message::Message(&local_2f08);
    pMVar3 = testing::Message::operator<<
                       (&local_2f08,(char (*) [37])"TKR source spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2ef0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tkr_source_expected_first_wavelength.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tkr_source_expected_first_wavelength.second,pMVar3);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&tkr_source_expected_first_wavelength.second);
    testing::Message::~Message(&local_2f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ef0);
  local_2f28 = 0.3;
  tkr_source_expected_last_wavelength.second = 0.0;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2f20,&local_2f28,
             &tkr_source_expected_last_wavelength.second);
  local_2f48 = 4.045;
  gtest_ar__26.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x401b99999999999a;
  std::pair<double,_double>::pair<double,_double,_true>
            ((pair<double,_double> *)local_2f40,&local_2f48,(double *)&gtest_ar__26.message_);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tkr.source_spectrum.b,0);
  PAIR_NEAR((pair<double,_double> *)local_2f60,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f60);
  if (!bVar1) {
    testing::Message::Message(&local_2f68);
    pMVar3 = testing::Message::operator<<
                       (&local_2f68,(char (*) [32])"TKR source spectrum first point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_2f60,
               (AssertionResult *)
               "PAIR_NEAR(tkr.source_spectrum.values[0], tkr_source_expected_first_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__27.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f70,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2f70);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_2f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f60);
  pvVar5 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
           operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       *)&tkr.source_spectrum.b,0x78);
  PAIR_NEAR((pair<double,_double> *)local_2fa0,pvVar5,1e-14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2fa0);
  if (!bVar1) {
    testing::Message::Message(&local_2fa8);
    pMVar3 = testing::Message::operator<<
                       (&local_2fa8,(char (*) [31])"TKR source spectrum last point");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_131.message_,(internal *)local_2fa0,
               (AssertionResult *)
               "PAIR_NEAR(tkr.source_spectrum.values[120], tkr_source_expected_last_wavelength, 1e-14)"
               ,"false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_131.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_2fb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2fb0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_2fb0);
    std::__cxx11::string::~string((string *)&gtest_ar_131.message_);
    testing::Message::~Message(&local_2fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2fa0);
  local_2fe4 = KROCHMANN;
  testing::internal::EqHelper::
  Compare<window_standards::Spectrum_Type,_window_standards::Spectrum_Type,_nullptr>
            ((EqHelper *)local_2fe0,"tkr.detector_spectrum.type","Spectrum_Type::KROCHMANN",
             (Spectrum_Type *)
             &tkr.source_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2fe4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2fe0);
  if (!bVar1) {
    testing::Message::Message(&local_2ff0);
    pMVar3 = testing::Message::operator<<(&local_2ff0,(char (*) [27])"TKR detector spectrum type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2fe0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_132.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_132.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_132.message_);
    testing::Message::~Message(&local_2ff0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2fe0);
  local_3010 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     *)&tkr.detector_spectrum.b);
  local_3014 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3008,"tkr.detector_spectrum.values.size()","0",&local_3010,
             &local_3014);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3008);
  if (!bVar1) {
    testing::Message::Message(&local_3020);
    pMVar3 = testing::Message::operator<<
                       (&local_3020,(char (*) [39])"TKR detector spectrum wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3008);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_133.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_133.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_133.message_);
    testing::Message::~Message(&local_3020);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3008);
  local_303c = SOURCE;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Set_Type,_window_standards::Wavelength_Set_Type,_nullptr>
            ((EqHelper *)local_3038,"tkr.wavelength_set.type","Wavelength_Set_Type::SOURCE",
             (Wavelength_Set_Type *)
             &tkr.detector_spectrum.values.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_303c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3038);
  if (!bVar1) {
    testing::Message::Message(&local_3048);
    pMVar3 = testing::Message::operator<<(&local_3048,(char (*) [24])"TKR wavelength set type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3038);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_134.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_134.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_134.message_);
    testing::Message::~Message(&local_3048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3038);
  local_3068 = std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&tkr.wavelength_set.description.field_2 + 8));
  local_306c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3060,"tkr.wavelength_set.values.size()","0",&local_3068,&local_306c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3060);
  if (!bVar1) {
    testing::Message::Message(&local_3078);
    pMVar3 = testing::Message::operator<<
                       (&local_3078,(char (*) [36])"TKR wavelength set wavelength count");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3060);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_135.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_135.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_135.message_);
    testing::Message::~Message(&local_3078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3060);
  local_3094 = TRAPEZOIDAL;
  testing::internal::EqHelper::
  Compare<window_standards::Integration_Rule_Type,_window_standards::Integration_Rule_Type,_nullptr>
            ((EqHelper *)local_3090,"tkr.integration_rule.type","Integration_Rule_Type::TRAPEZOIDAL"
             ,(Integration_Rule_Type *)
              &tkr.wavelength_set.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,&local_3094);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3090);
  if (!bVar1) {
    testing::Message::Message(&local_30a0);
    pMVar3 = testing::Message::operator<<(&local_30a0,(char (*) [26])"TKR integration rule type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3090);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_136.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_136.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_136.message_);
    testing::Message::~Message(&local_30a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3090);
  local_30c0 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_30b8,"tkr.integration_rule.k","1.0",(double *)&tkr.integration_rule,
             &local_30c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30b8);
  if (!bVar1) {
    testing::Message::Message(&local_30c8);
    pMVar3 = testing::Message::operator<<(&local_30c8,(char (*) [23])"TKR integration rule k");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_137.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_137.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_137.message_);
    testing::Message::~Message(&local_30c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30b8);
  local_30e4 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_30e0,"tkr.min_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tkr.integration_rule.k,&local_30e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30e0);
  if (!bVar1) {
    testing::Message::Message(&local_30f0);
    pMVar3 = testing::Message::operator<<(&local_30f0,(char (*) [28])"TKR minimum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_138.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_138.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_138.message_);
    testing::Message::~Message(&local_30f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30e0);
  local_3110 = 0.3;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_3108,"tkr.min_wavelength.value","0.3",(double *)&tkr.min_wavelength,
             &local_3110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3108);
  if (!bVar1) {
    testing::Message::Message(&local_3118);
    pMVar3 = testing::Message::operator<<(&local_3118,(char (*) [29])"TKR minimum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_139.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_139.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_139.message_);
    testing::Message::~Message(&local_3118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3108);
  local_3134 = NUMBER;
  testing::internal::EqHelper::
  Compare<window_standards::Wavelength_Boundary_Type,_window_standards::Wavelength_Boundary_Type,_nullptr>
            ((EqHelper *)local_3130,"tkr.max_wavelength.type","Wavelength_Boundary_Type::NUMBER",
             (Wavelength_Boundary_Type *)&tkr.min_wavelength.value,&local_3134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3130);
  if (!bVar1) {
    testing::Message::Message(&local_3140);
    pMVar3 = testing::Message::operator<<(&local_3140,(char (*) [28])"TKR maximum wavelength type");
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_140.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_140.message_,pMVar3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_140.message_);
    testing::Message::~Message(&local_3140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3130);
  local_3160 = 0.5;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_3158,"tkr.max_wavelength.value","0.5",(double *)&tkr.max_wavelength,
             &local_3160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3158);
  if (!bVar1) {
    testing::Message::Message(&local_3168);
    pMVar3 = testing::Message::operator<<(&local_3168,(char (*) [29])"TKR maximum wavelength value")
    ;
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3158);
    testing::internal::AssertHelper::AssertHelper
              (&local_3170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3170,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_3170);
    testing::Message::~Message(&local_3168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3158);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_1078);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_ef0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_d68);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_be0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_a58);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_8d0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_748);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_5c0);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_438);
  window_standards::Optical_Standard_Method::~Optical_Standard_Method
            ((Optical_Standard_Method *)local_2b0);
  window_standards::Optical_Standard::~Optical_Standard((Optical_Standard *)local_e0);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&nfrc_std_path.field_0x27);
  return;
}

Assistant:

TEST_F(TestLoadStandardFromDisk, TestLoadNFRC2003) {
	SCOPED_TRACE( "Begin Test: Load NFRC 2003 from disk." );
	
	std::filesystem::path nfrc_std_path(test_dir);
	nfrc_std_path /= "standards";
	nfrc_std_path /= "W5_NFRC_2003.std";

	Optical_Standard nfrc = load_optical_standard(nfrc_std_path.string());
	EXPECT_EQ(nfrc.description, "Consistent with NFRC 300-2003 - default for WINDOW5");
	EXPECT_EQ(nfrc.methods.size(), 10) << "Number of methods loaded";
	Optical_Standard_Method solar = nfrc.methods["SOLAR"];
	Optical_Standard_Method photopic = nfrc.methods["PHOTOPIC"];
	Optical_Standard_Method tristim_x = nfrc.methods["COLOR_TRISTIMX"];
	Optical_Standard_Method tristim_y = nfrc.methods["COLOR_TRISTIMY"];
	Optical_Standard_Method tristim_z = nfrc.methods["COLOR_TRISTIMZ"];
	Optical_Standard_Method thermal_ir = nfrc.methods["THERMAL IR"];
	Optical_Standard_Method tuv = nfrc.methods["TUV"];
	Optical_Standard_Method spf = nfrc.methods["SPF"];
	Optical_Standard_Method tdw = nfrc.methods["TDW"];
	Optical_Standard_Method tkr = nfrc.methods["TKR"];

	EXPECT_EQ(solar.name, "SOLAR") << "Solar method type";
	EXPECT_EQ(solar.source_spectrum.type, Spectrum_Type::FILE) << "Solar source spectrum type";
	EXPECT_EQ(solar.source_spectrum.values.size(), 121) << "Solar source spectrum wavelength count";
	std::pair<double, double> solar_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> solar_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(solar.source_spectrum.values[0], solar_expected_first_wavelength, 1e-14)) << "Solar source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(solar.source_spectrum.values[120], solar_expected_last_wavelength, 1e-14)) << "Solar source spectrum last point";
	EXPECT_EQ(solar.detector_spectrum.type, Spectrum_Type::NONE) << "Solar detector spectrum type";
	EXPECT_EQ(solar.detector_spectrum.values.size(), 0) << "Solar detector spectrum wavelength count";
	EXPECT_EQ(solar.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "Solar wavelength set type";
	EXPECT_EQ(solar.wavelength_set.values.size(), 0) << "Solar wavelength set wavelength count";
	EXPECT_EQ(solar.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Solar integration rule type";
	EXPECT_EQ(solar.integration_rule.k, 1.0) << "Solar integration rule k";
	EXPECT_EQ(solar.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Solar minimum wavelength type";
	EXPECT_EQ(solar.min_wavelength.value, 0.3) << "Solar minimum wavelength value";
	EXPECT_EQ(solar.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Solar maximum wavelength type";
	EXPECT_EQ(solar.max_wavelength.value, 2.5) << "Solar maximum wavelength value";

	EXPECT_EQ(photopic.name, "PHOTOPIC") << "Photopic method type";

	EXPECT_EQ(photopic.source_spectrum.type, Spectrum_Type::FILE) << "Photopic source spectrum type";
	EXPECT_EQ(photopic.source_spectrum.values.size(), 531) << "Photopic source spectrum wavelength count";
	std::pair<double, double> photopic_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> photopic_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(photopic.source_spectrum.values[0], photopic_source_expected_first_wavelength, 1e-14)) << "Photopic source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(photopic.source_spectrum.values[530], photopic_source_expected_last_wavelength, 1e-14)) << "Photopic source spectrum last point";
	EXPECT_EQ(photopic.detector_spectrum.type, Spectrum_Type::FILE) << "Photopic detector spectrum type";
	EXPECT_EQ(photopic.detector_spectrum.values.size(), 81) << "Photopic detector spectrum wavelength count";
	std::pair<double, double> photopic_detector_expected_first_nonzero_wavelength(0.385, 0.0001);
	std::pair<double, double> photopic_detector_expected_last_nonzero_wavelength(0.76, 0.0001);
	EXPECT_TRUE(PAIR_NEAR(photopic.detector_spectrum.values[1], photopic_detector_expected_first_nonzero_wavelength, 1e-14)) << "Photopic detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(photopic.detector_spectrum.values[76], photopic_detector_expected_last_nonzero_wavelength, 1e-14)) << "Photopic detector spectrum last nonzero point";
	EXPECT_EQ(photopic.wavelength_set.type, Wavelength_Set_Type::FILE) << "Photopic wavelength set type";
	EXPECT_EQ(photopic.wavelength_set.values.size(), 81) << "Photopic wavelength set wavelength count";
	EXPECT_EQ(photopic.wavelength_set.values[0], 0.38) << "Photopic wavelength set first point";
	EXPECT_EQ(photopic.wavelength_set.values[80], 0.78) << "Photopic wavelength set last point";
	EXPECT_EQ(photopic.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Photopic integration rule type";
	EXPECT_EQ(photopic.integration_rule.k, 1.0) << "Photopic integration rule k";
	EXPECT_EQ(photopic.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Photopic minimum wavelength type";
	EXPECT_EQ(photopic.min_wavelength.value, 0.38) << "Photopic minimum wavelength value";
	EXPECT_EQ(photopic.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Photopic maximum wavelength type";
	EXPECT_EQ(photopic.max_wavelength.value, 0.78) << "Photopic maximum wavelength value";

	EXPECT_EQ(tristim_x.name, "COLOR_TRISTIMX") << "Tristim X method type";
	EXPECT_EQ(tristim_x.source_spectrum.type, Spectrum_Type::FILE) << "Tristim X source spectrum type";
	EXPECT_EQ(tristim_x.source_spectrum.values.size(), 531) << "Tristim_x source spectrum wavelength count";
	std::pair<double, double> tristim_x_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> tristim_x_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(tristim_x.source_spectrum.values[0], tristim_x_source_expected_first_wavelength, 1e-14)) << "Tristim_x source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tristim_x.source_spectrum.values[530], tristim_x_source_expected_last_wavelength, 1e-14)) << "Tristim_x source spectrum last point";
	EXPECT_EQ(tristim_x.detector_spectrum.type, Spectrum_Type::FILE) << "Tristim_x detector spectrum type";
	EXPECT_EQ(tristim_x.detector_spectrum.values.size(), 81) << "Tristim_x detector spectrum wavelength count";
	std::pair<double, double> tristim_x_detector_expected_first_nonzero_wavelength(0.38, 0.0002);
	std::pair<double, double> tristim_x_detector_expected_last_nonzero_wavelength(0.77, 0.0001);
	EXPECT_TRUE(PAIR_NEAR(tristim_x.detector_spectrum.values[0], tristim_x_detector_expected_first_nonzero_wavelength, 1e-14)) << "Tristim_x detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(tristim_x.detector_spectrum.values[78], tristim_x_detector_expected_last_nonzero_wavelength, 1e-14)) << "Tristim_x detector spectrum last nonzero point";
	EXPECT_EQ(tristim_x.wavelength_set.type, Wavelength_Set_Type::FILE) << "Tristim_x wavelength set type";
	EXPECT_EQ(tristim_x.wavelength_set.values.size(), 81) << "Tristim_x wavelength set wavelength count";
	EXPECT_EQ(tristim_x.wavelength_set.values[0], 0.38) << "Tristim_x wavelength set first point";
	EXPECT_EQ(tristim_x.wavelength_set.values[80], 0.78) << "Tristim_x wavelength set last point";
	EXPECT_EQ(tristim_x.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Tristim_x integration rule type";
	EXPECT_EQ(tristim_x.integration_rule.k, 1.0) << "Tristim_x integration rule k";
	EXPECT_EQ(tristim_x.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_x minimum wavelength type";
	EXPECT_EQ(tristim_x.min_wavelength.value, 0.38) << "Tristim_x minimum wavelength value";
	EXPECT_EQ(tristim_x.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_x maximum wavelength type";
	EXPECT_EQ(tristim_x.max_wavelength.value, 0.78) << "Tristim_x maximum wavelength value";

	EXPECT_EQ(tristim_y.name, "COLOR_TRISTIMY") << "Tristim Y method type";
	EXPECT_EQ(tristim_y.source_spectrum.type, Spectrum_Type::FILE) << "Tristim Y source spectrum type";
	EXPECT_EQ(tristim_y.source_spectrum.values.size(), 531) << "Tristim_y source spectrum wavelength count";
	std::pair<double, double> tristim_y_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> tristim_y_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(tristim_y.source_spectrum.values[0], tristim_y_source_expected_first_wavelength, 1e-14)) << "Tristim_y source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tristim_y.source_spectrum.values[530], tristim_y_source_expected_last_wavelength, 1e-14)) << "Tristim_y source spectrum last point";
	EXPECT_EQ(tristim_y.detector_spectrum.type, Spectrum_Type::FILE) << "Tristim_y detector spectrum type";
	EXPECT_EQ(tristim_y.detector_spectrum.values.size(), 81) << "Tristim_y detector spectrum wavelength count";
	std::pair<double, double> tristim_y_detector_expected_first_nonzero_wavelength(0.385, 0.0001);
	std::pair<double, double> tristim_y_detector_expected_last_nonzero_wavelength(0.755, 0.0001);
	EXPECT_TRUE(PAIR_NEAR(tristim_y.detector_spectrum.values[1], tristim_y_detector_expected_first_nonzero_wavelength, 1e-14)) << "Tristim_y detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(tristim_y.detector_spectrum.values[75], tristim_y_detector_expected_last_nonzero_wavelength, 1e-14)) << "Tristim_y detector spectrum last nonzero point";
	EXPECT_EQ(tristim_y.wavelength_set.type, Wavelength_Set_Type::FILE) << "Tristim_y wavelength set type";
	EXPECT_EQ(tristim_y.wavelength_set.values.size(), 81) << "Tristim_y wavelength set wavelength count";
	EXPECT_EQ(tristim_y.wavelength_set.values[0], 0.38) << "Tristim_y wavelength set first point";
	EXPECT_EQ(tristim_y.wavelength_set.values[80], 0.78) << "Tristim_y wavelength set last point";
	EXPECT_EQ(tristim_y.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Tristim_y integration rule type";
	EXPECT_EQ(tristim_y.integration_rule.k, 1.0) << "Tristim_y integration rule k";
	EXPECT_EQ(tristim_y.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_y minimum wavelength type";
	EXPECT_EQ(tristim_y.min_wavelength.value, 0.38) << "Tristim_y minimum wavelength value";
	EXPECT_EQ(tristim_y.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_y maximum wavelength type";
	EXPECT_EQ(tristim_y.max_wavelength.value, 0.78) << "Tristim_y maximum wavelength value";

	EXPECT_EQ(tristim_z.name, "COLOR_TRISTIMZ") << "Tristim Z method type";
	EXPECT_EQ(tristim_z.source_spectrum.type, Spectrum_Type::FILE) << "Tristim Z source spectrum type";
	EXPECT_EQ(tristim_z.source_spectrum.values.size(), 531) << "Tristim_z source spectrum wavelength count";
	std::pair<double, double> tristim_z_source_expected_first_wavelength(0.3, 0.0341);
	std::pair<double, double> tristim_z_source_expected_last_wavelength(0.83, 60.3125);
	EXPECT_TRUE(PAIR_NEAR(tristim_z.source_spectrum.values[0], tristim_z_source_expected_first_wavelength, 1e-14)) << "Tristim_z source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tristim_z.source_spectrum.values[530], tristim_z_source_expected_last_wavelength, 1e-14)) << "Tristim_z source spectrum last point";
	EXPECT_EQ(tristim_z.detector_spectrum.type, Spectrum_Type::FILE) << "Tristim_z detector spectrum type";
	EXPECT_EQ(tristim_z.detector_spectrum.values.size(), 81) << "Tristim_z detector spectrum wavelength count";
	std::pair<double, double> tristim_z_detector_expected_first_nonzero_wavelength(0.38, 0.0007);
	std::pair<double, double> tristim_z_detector_expected_last_nonzero_wavelength(0.555, 0.0011);
	EXPECT_TRUE(PAIR_NEAR(tristim_z.detector_spectrum.values[0], tristim_z_detector_expected_first_nonzero_wavelength, 1e-14)) << "Tristim_z detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(tristim_z.detector_spectrum.values[35], tristim_z_detector_expected_last_nonzero_wavelength, 1e-14)) << "Tristim_z detector spectrum last nonzero point";
	EXPECT_EQ(tristim_z.wavelength_set.type, Wavelength_Set_Type::FILE) << "Tristim_z wavelength set type";
	EXPECT_EQ(tristim_z.wavelength_set.values.size(), 81) << "Tristim_z wavelength set wavelength count";
	EXPECT_EQ(tristim_z.wavelength_set.values[0], 0.38) << "Tristim_z wavelength set first point";
	EXPECT_EQ(tristim_z.wavelength_set.values[80], 0.78) << "Tristim_z wavelength set last point";
	EXPECT_EQ(tristim_z.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Tristim_z integration rule type";
	EXPECT_EQ(tristim_z.integration_rule.k, 1.0) << "Tristim_z integration rule k";
	EXPECT_EQ(tristim_z.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_z minimum wavelength type";
	EXPECT_EQ(tristim_z.min_wavelength.value, 0.38) << "Tristim_z minimum wavelength value";
	EXPECT_EQ(tristim_z.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Tristim_z maximum wavelength type";
	EXPECT_EQ(tristim_z.max_wavelength.value, 0.78) << "Tristim_z maximum wavelength value";

	EXPECT_EQ(thermal_ir.name, "THERMAL IR") << "Thermal IR method type";
	EXPECT_EQ(thermal_ir.source_spectrum.type, Spectrum_Type::BLACKBODY) << "Thermal_IR source spectrum type";
	EXPECT_EQ(thermal_ir.source_spectrum.values.size(), 0) << "Thermal_IR source spectrum wavelength count";	
	EXPECT_EQ(thermal_ir.source_spectrum.t, 300) << "Thermal_IR source spectrum t";
	EXPECT_EQ(thermal_ir.detector_spectrum.type, Spectrum_Type::NONE) << "Thermal_IR detector spectrum type";
	EXPECT_EQ(thermal_ir.detector_spectrum.values.size(), 0) << "Thermal_IR detector spectrum wavelength count";
	EXPECT_EQ(thermal_ir.wavelength_set.type, Wavelength_Set_Type::DATA) << "Thermal_IR wavelength set type";
	EXPECT_EQ(thermal_ir.wavelength_set.values.size(), 0) << "Thermal_IR wavelength set wavelength count";
	EXPECT_EQ(thermal_ir.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "Thermal_IR integration rule type";
	EXPECT_EQ(thermal_ir.integration_rule.k, 1.0) << "Thermal_IR integration rule k";
	EXPECT_EQ(thermal_ir.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "Thermal_IR minimum wavelength type";
	EXPECT_EQ(thermal_ir.min_wavelength.value, 5.0) << "Thermal_IR minimum wavelength value";
	EXPECT_EQ(thermal_ir.max_wavelength.type, Wavelength_Boundary_Type::WAVELENGTH_SET) << "Thermal_IR maximum wavelength type";

	EXPECT_EQ(tuv.name, "TUV") << "TUV method type";
	EXPECT_EQ(tuv.source_spectrum.type, Spectrum_Type::FILE) << "TUV source spectrum type";
	EXPECT_EQ(tuv.source_spectrum.values.size(), 121) << "TUV source spectrum wavelength count";
	std::pair<double, double> tuv_source_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> tuv_source_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(tuv.source_spectrum.values[0], tuv_source_expected_first_wavelength, 1e-14)) << "TUV source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tuv.source_spectrum.values[120], tuv_source_expected_last_wavelength, 1e-14)) << "TUV source spectrum last point";
	EXPECT_EQ(tuv.detector_spectrum.type, Spectrum_Type::NONE) << "TUV detector spectrum type";
	EXPECT_EQ(tuv.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "TUV wavelength set type";
	EXPECT_EQ(tuv.wavelength_set.values.size(), 0) << "TUV wavelength set wavelength count";
	EXPECT_EQ(tuv.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "TUV integration rule type";
	EXPECT_EQ(tuv.integration_rule.k, 1.0) << "TUV integration rule k";
	EXPECT_EQ(tuv.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TUV minimum wavelength type";
	EXPECT_EQ(tuv.min_wavelength.value, 0.31) << "TUV minimum wavelength value";
	EXPECT_EQ(tuv.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TUV maximum wavelength type";
	EXPECT_EQ(tuv.max_wavelength.value, 0.38) << "TUV maximum wavelength value";

	EXPECT_EQ(spf.name, "SPF") << "SPF method type";
	EXPECT_EQ(spf.source_spectrum.type, Spectrum_Type::FILE) << "SPF source spectrum type";
	EXPECT_EQ(spf.source_spectrum.values.size(), 61) << "SPF source spectrum wavelength count";
	std::pair<double, double> spf_source_expected_first_wavelength(0.28, 4.12e-11);
	std::pair<double, double> spf_source_expected_last_wavelength(0.4, 0.000101);
	EXPECT_TRUE(PAIR_NEAR(spf.source_spectrum.values[0], spf_source_expected_first_wavelength, 1e-14)) << "SPF source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(spf.source_spectrum.values[60], spf_source_expected_last_wavelength, 1e-14)) << "SPF source spectrum last point";
	EXPECT_EQ(spf.detector_spectrum.type, Spectrum_Type::FILE) << "SPF detector spectrum type";
	EXPECT_EQ(spf.detector_spectrum.values.size(), 61) << "SPF detector spectrum wavelength count";
	std::pair<double, double> spf_detector_expected_first_nonzero_wavelength(0.28, 1.00);
	std::pair<double, double> spf_detector_expected_last_nonzero_wavelength(0.4, 0.000122);
	EXPECT_TRUE(PAIR_NEAR(spf.detector_spectrum.values[0], spf_detector_expected_first_nonzero_wavelength, 1e-14)) << "SPF detector spectrum first nonzero point";
	EXPECT_TRUE(PAIR_NEAR(spf.detector_spectrum.values[60], spf_detector_expected_last_nonzero_wavelength, 1e-14)) << "SPF detector spectrum last nonzero point";
	EXPECT_EQ(spf.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "SPF wavelength set type";
	EXPECT_EQ(spf.wavelength_set.values.size(), 0) << "SPF wavelength set wavelength count";
	EXPECT_EQ(spf.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "SPF integration rule type";
	EXPECT_EQ(spf.integration_rule.k, 1.0) << "SPF integration rule k";
	EXPECT_EQ(spf.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "SPF minimum wavelength type";
	EXPECT_EQ(spf.min_wavelength.value, 0.28) << "SPF minimum wavelength value";
	EXPECT_EQ(spf.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "SPF maximum wavelength type";
	EXPECT_EQ(spf.max_wavelength.value, 0.4) << "SPF maximum wavelength value";

	EXPECT_EQ(tdw.name, "TDW") << "TDW method type";
	EXPECT_EQ(tdw.source_spectrum.type, Spectrum_Type::FILE) << "TDW source spectrum type";
	EXPECT_EQ(tdw.source_spectrum.values.size(), 121) << "TDW source spectrum wavelength count";
	std::pair<double, double> tdw_source_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> tdw_source_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(tdw.source_spectrum.values[0], tdw_source_expected_first_wavelength, 1e-14)) << "TDW source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tdw.source_spectrum.values[120], tdw_source_expected_last_wavelength, 1e-14)) << "TDW source spectrum last point";
	EXPECT_EQ(tdw.detector_spectrum.type, Spectrum_Type::UV_ACTION) << "TDW detector spectrum type";
	EXPECT_EQ(tdw.detector_spectrum.values.size(), 0) << "TDW detector spectrum wavelength count";
	EXPECT_EQ(tdw.detector_spectrum.a, 3.6) << "TDW detector spectrum a";
	EXPECT_EQ(tdw.detector_spectrum.b, 12) << "TDW detector spectrum b";
	EXPECT_EQ(tdw.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "TDW wavelength set type";
	EXPECT_EQ(tdw.wavelength_set.values.size(), 0) << "TDW wavelength set wavelength count";
	EXPECT_EQ(tdw.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "TDW integration rule type";
	EXPECT_EQ(tdw.integration_rule.k, 1.0) << "TDW integration rule k";
	EXPECT_EQ(tdw.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TDW minimum wavelength type";
	EXPECT_EQ(tdw.min_wavelength.value, 0.3) << "TDW minimum wavelength value";
	EXPECT_EQ(tdw.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TDW maximum wavelength type";
	EXPECT_EQ(tdw.max_wavelength.value, 0.7) << "TDW maximum wavelength value";

	EXPECT_EQ(tkr.name, "TKR") << "TKR method type";
	EXPECT_EQ(tkr.source_spectrum.type, Spectrum_Type::FILE) << "TKR source spectrum type";
	EXPECT_EQ(tkr.source_spectrum.values.size(), 121) << "TKR source spectrum wavelength count";
	std::pair<double, double> tkr_source_expected_first_wavelength(0.3, 0.0);
	std::pair<double, double> tkr_source_expected_last_wavelength(4.045, 6.9);
	EXPECT_TRUE(PAIR_NEAR(tkr.source_spectrum.values[0], tkr_source_expected_first_wavelength, 1e-14)) << "TKR source spectrum first point";
	EXPECT_TRUE(PAIR_NEAR(tkr.source_spectrum.values[120], tkr_source_expected_last_wavelength, 1e-14)) << "TKR source spectrum last point";
	EXPECT_EQ(tkr.detector_spectrum.type, Spectrum_Type::KROCHMANN) << "TKR detector spectrum type";
	EXPECT_EQ(tkr.detector_spectrum.values.size(), 0) << "TKR detector spectrum wavelength count";
	EXPECT_EQ(tkr.wavelength_set.type, Wavelength_Set_Type::SOURCE) << "TKR wavelength set type";
	EXPECT_EQ(tkr.wavelength_set.values.size(), 0) << "TKR wavelength set wavelength count";
	EXPECT_EQ(tkr.integration_rule.type, Integration_Rule_Type::TRAPEZOIDAL) << "TKR integration rule type";
	EXPECT_EQ(tkr.integration_rule.k, 1.0) << "TKR integration rule k";
	EXPECT_EQ(tkr.min_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TKR minimum wavelength type";
	EXPECT_EQ(tkr.min_wavelength.value, 0.3) << "TKR minimum wavelength value";
	EXPECT_EQ(tkr.max_wavelength.type, Wavelength_Boundary_Type::NUMBER) << "TKR maximum wavelength type";
	EXPECT_EQ(tkr.max_wavelength.value, 0.5) << "TKR maximum wavelength value";
}